

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNvIntersectorK<8,8>::
intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
          (CurveNvIntersectorK<8,8> *this,Precalculations *pre,RayHitK<8> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  Vector *pVVar1;
  float fVar2;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  ulong uVar77;
  byte bVar78;
  int iVar79;
  byte bVar80;
  long lVar81;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar150;
  uint uVar151;
  uint uVar153;
  uint uVar154;
  uint uVar155;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  uint uVar152;
  uint uVar156;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float pp;
  float fVar157;
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  float fVar176;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar165 [32];
  float fVar175;
  float fVar177;
  float fVar178;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar193 [16];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar235;
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 in_ZMM4 [64];
  float fVar248;
  undefined1 auVar245 [32];
  undefined1 auVar244 [16];
  undefined1 auVar246 [32];
  undefined1 auVar243 [16];
  undefined1 auVar247 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [64];
  float fVar260;
  undefined1 auVar256 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar259;
  undefined1 auVar257 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  float fVar265;
  undefined1 auVar264 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  float fVar272;
  float fVar273;
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  Precalculations *local_8b8;
  int *local_8b0;
  undefined4 local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 (*local_820) [32];
  long local_818;
  RayQueryContext *local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  bVar72 = *(byte *)((long)&context->scene + 1);
  uVar83 = (ulong)bVar72;
  lVar81 = (long)context + uVar83 * 0x19 + 0x16;
  fVar2 = *(float *)((long)context + uVar83 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x20)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)pre->ray_space[0].vz.field_0.m128[(long)ray]),0x20);
  auVar13 = vinsertps_avx(ZEXT416((uint)pre->ray_space[2].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[2].vz.field_0.m128[(long)ray]),0x10);
  auVar89 = vinsertps_avx(auVar13,ZEXT416((uint)pre->ray_space[3].vy.field_0.m128[(long)ray]),0x20);
  auVar90 = vsubps_avx(auVar12,*(undefined1 (*) [16])((long)context + uVar83 * 0x19 + 6));
  fVar217 = fVar2 * auVar90._0_4_;
  fVar157 = fVar2 * auVar89._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar12);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar13);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar87);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 0xb + 6);
  auVar106 = vpmovsxbd_avx2(auVar92);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 0xc + 6);
  auVar107 = vpmovsxbd_avx2(auVar85);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 0xd + 6);
  auVar105 = vpmovsxbd_avx2(auVar97);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 0x12 + 6);
  auVar108 = vpmovsxbd_avx2(auVar93);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 0x13 + 6);
  auVar109 = vpmovsxbd_avx2(auVar86);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)((long)&context->scene + uVar83 * 0x14 + 6);
  auVar111 = vpmovsxbd_avx2(auVar88);
  auVar110 = vcvtdq2ps_avx(auVar111);
  auVar118._4_4_ = fVar157;
  auVar118._0_4_ = fVar157;
  auVar118._8_4_ = fVar157;
  auVar118._12_4_ = fVar157;
  auVar118._16_4_ = fVar157;
  auVar118._20_4_ = fVar157;
  auVar118._24_4_ = fVar157;
  auVar118._28_4_ = fVar157;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar101 = ZEXT1632(CONCAT412(fVar2 * auVar89._12_4_,
                                CONCAT48(fVar2 * auVar89._8_4_,
                                         CONCAT44(fVar2 * auVar89._4_4_,fVar157))));
  auVar100 = vpermps_avx2(auVar120,auVar101);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = vpermps_avx512vl(auVar98,auVar101);
  fVar157 = auVar99._0_4_;
  auVar247._0_4_ = fVar157 * auVar103._0_4_;
  fVar174 = auVar99._4_4_;
  auVar247._4_4_ = fVar174 * auVar103._4_4_;
  fVar176 = auVar99._8_4_;
  auVar247._8_4_ = fVar176 * auVar103._8_4_;
  fVar258 = auVar99._12_4_;
  auVar247._12_4_ = fVar258 * auVar103._12_4_;
  fVar259 = auVar99._16_4_;
  auVar247._16_4_ = fVar259 * auVar103._16_4_;
  fVar260 = auVar99._20_4_;
  auVar247._20_4_ = fVar260 * auVar103._20_4_;
  fVar235 = auVar99._24_4_;
  auVar247._28_36_ = in_ZMM4._28_36_;
  auVar247._24_4_ = fVar235 * auVar103._24_4_;
  auVar101._4_4_ = auVar105._4_4_ * fVar174;
  auVar101._0_4_ = auVar105._0_4_ * fVar157;
  auVar101._8_4_ = auVar105._8_4_ * fVar176;
  auVar101._12_4_ = auVar105._12_4_ * fVar258;
  auVar101._16_4_ = auVar105._16_4_ * fVar259;
  auVar101._20_4_ = auVar105._20_4_ * fVar260;
  auVar101._24_4_ = auVar105._24_4_ * fVar235;
  auVar101._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar110._4_4_ * fVar174;
  auVar111._0_4_ = auVar110._0_4_ * fVar157;
  auVar111._8_4_ = auVar110._8_4_ * fVar176;
  auVar111._12_4_ = auVar110._12_4_ * fVar258;
  auVar111._16_4_ = auVar110._16_4_ * fVar259;
  auVar111._20_4_ = auVar110._20_4_ * fVar260;
  auVar111._24_4_ = auVar110._24_4_ * fVar235;
  auVar111._28_4_ = auVar99._28_4_;
  auVar12 = vfmadd231ps_fma(auVar247._0_32_,auVar100,auVar102);
  auVar13 = vfmadd231ps_fma(auVar101,auVar100,auVar107);
  auVar87 = vfmadd231ps_fma(auVar111,auVar109,auVar100);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,auVar104);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar118,auVar106);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar108,auVar118);
  auVar119._4_4_ = fVar217;
  auVar119._0_4_ = fVar217;
  auVar119._8_4_ = fVar217;
  auVar119._12_4_ = fVar217;
  auVar119._16_4_ = fVar217;
  auVar119._20_4_ = fVar217;
  auVar119._24_4_ = fVar217;
  auVar119._28_4_ = fVar217;
  auVar100 = ZEXT1632(CONCAT412(fVar2 * auVar90._12_4_,
                                CONCAT48(fVar2 * auVar90._8_4_,
                                         CONCAT44(fVar2 * auVar90._4_4_,fVar217))));
  auVar111 = vpermps_avx2(auVar120,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  auVar101 = vmulps_avx512vl(auVar100,auVar103);
  auVar113._0_4_ = auVar100._0_4_ * auVar105._0_4_;
  auVar113._4_4_ = auVar100._4_4_ * auVar105._4_4_;
  auVar113._8_4_ = auVar100._8_4_ * auVar105._8_4_;
  auVar113._12_4_ = auVar100._12_4_ * auVar105._12_4_;
  auVar113._16_4_ = auVar100._16_4_ * auVar105._16_4_;
  auVar113._20_4_ = auVar100._20_4_ * auVar105._20_4_;
  auVar113._24_4_ = auVar100._24_4_ * auVar105._24_4_;
  auVar113._28_4_ = 0;
  auVar105._4_4_ = auVar100._4_4_ * auVar110._4_4_;
  auVar105._0_4_ = auVar100._0_4_ * auVar110._0_4_;
  auVar105._8_4_ = auVar100._8_4_ * auVar110._8_4_;
  auVar105._12_4_ = auVar100._12_4_ * auVar110._12_4_;
  auVar105._16_4_ = auVar100._16_4_ * auVar110._16_4_;
  auVar105._20_4_ = auVar100._20_4_ * auVar110._20_4_;
  auVar105._24_4_ = auVar100._24_4_ * auVar110._24_4_;
  auVar105._28_4_ = auVar103._28_4_;
  auVar102 = vfmadd231ps_avx512vl(auVar101,auVar111,auVar102);
  auVar92 = vfmadd231ps_fma(auVar113,auVar111,auVar107);
  auVar85 = vfmadd231ps_fma(auVar105,auVar111,auVar109);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar119,auVar104);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar119,auVar106);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar119,auVar108);
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  auVar104 = vandps_avx(ZEXT1632(auVar12),auVar115);
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar104,auVar117,1);
  bVar82 = (bool)((byte)uVar76 & 1);
  auVar100._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar12._0_4_;
  bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar12._4_4_;
  bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar12._8_4_;
  bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar12._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar13),auVar115);
  uVar76 = vcmpps_avx512vl(auVar104,auVar117,1);
  bVar82 = (bool)((byte)uVar76 & 1);
  auVar98._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar13._0_4_;
  bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar13._4_4_;
  bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar13._8_4_;
  bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar13._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar87),auVar115);
  uVar76 = vcmpps_avx512vl(auVar104,auVar117,1);
  bVar82 = (bool)((byte)uVar76 & 1);
  auVar104._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._0_4_;
  bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._4_4_;
  bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._8_4_;
  bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar100);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar100,auVar103,auVar116);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar98);
  auVar13 = vfnmadd213ps_fma(auVar98,auVar103,auVar116);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar104);
  auVar87 = vfnmadd213ps_fma(auVar104,auVar103,auVar116);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar103,auVar103);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar83 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx512vl(auVar104,auVar102);
  auVar108._4_4_ = auVar12._4_4_ * auVar104._4_4_;
  auVar108._0_4_ = auVar12._0_4_ * auVar104._0_4_;
  auVar108._8_4_ = auVar12._8_4_ * auVar104._8_4_;
  auVar108._12_4_ = auVar12._12_4_ * auVar104._12_4_;
  auVar108._16_4_ = auVar104._16_4_ * 0.0;
  auVar108._20_4_ = auVar104._20_4_ * 0.0;
  auVar108._24_4_ = auVar104._24_4_ * 0.0;
  auVar108._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar83 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx512vl(auVar104,auVar102);
  auVar114._0_4_ = auVar12._0_4_ * auVar104._0_4_;
  auVar114._4_4_ = auVar12._4_4_ * auVar104._4_4_;
  auVar114._8_4_ = auVar12._8_4_ * auVar104._8_4_;
  auVar114._12_4_ = auVar12._12_4_ * auVar104._12_4_;
  auVar114._16_4_ = auVar104._16_4_ * 0.0;
  auVar114._20_4_ = auVar104._20_4_ * 0.0;
  auVar114._24_4_ = auVar104._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar83 * 0xe + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar92));
  auVar105 = vpbroadcastd_avx512vl();
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar72 * 0x10 + 6)
                           );
  auVar109._4_4_ = auVar13._4_4_ * auVar104._4_4_;
  auVar109._0_4_ = auVar13._0_4_ * auVar104._0_4_;
  auVar109._8_4_ = auVar13._8_4_ * auVar104._8_4_;
  auVar109._12_4_ = auVar13._12_4_ * auVar104._12_4_;
  auVar109._16_4_ = auVar104._16_4_ * 0.0;
  auVar109._20_4_ = auVar104._20_4_ * 0.0;
  auVar109._24_4_ = auVar104._24_4_ * 0.0;
  auVar109._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar92));
  auVar112._0_4_ = auVar13._0_4_ * auVar104._0_4_;
  auVar112._4_4_ = auVar13._4_4_ * auVar104._4_4_;
  auVar112._8_4_ = auVar13._8_4_ * auVar104._8_4_;
  auVar112._12_4_ = auVar13._12_4_ * auVar104._12_4_;
  auVar112._16_4_ = auVar104._16_4_ * 0.0;
  auVar112._20_4_ = auVar104._20_4_ * 0.0;
  auVar112._24_4_ = auVar104._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar83 * 0x15 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar85));
  auVar110._4_4_ = auVar104._4_4_ * auVar87._4_4_;
  auVar110._0_4_ = auVar104._0_4_ * auVar87._0_4_;
  auVar110._8_4_ = auVar104._8_4_ * auVar87._8_4_;
  auVar110._12_4_ = auVar104._12_4_ * auVar87._12_4_;
  auVar110._16_4_ = auVar104._16_4_ * 0.0;
  auVar110._20_4_ = auVar104._20_4_ * 0.0;
  auVar110._24_4_ = auVar104._24_4_ * 0.0;
  auVar110._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar83 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar85));
  auVar99._0_4_ = auVar87._0_4_ * auVar104._0_4_;
  auVar99._4_4_ = auVar87._4_4_ * auVar104._4_4_;
  auVar99._8_4_ = auVar87._8_4_ * auVar104._8_4_;
  auVar99._12_4_ = auVar87._12_4_ * auVar104._12_4_;
  auVar99._16_4_ = auVar104._16_4_ * 0.0;
  auVar99._20_4_ = auVar104._20_4_ * 0.0;
  auVar99._24_4_ = auVar104._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar108,auVar114);
  auVar102 = vpminsd_avx2(auVar109,auVar112);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar110,auVar99);
  uVar182 = *(undefined4 *)((long)&pre->ray_space[1].vy.field_0 + (long)ray * 4);
  auVar103._4_4_ = uVar182;
  auVar103._0_4_ = uVar182;
  auVar103._8_4_ = uVar182;
  auVar103._12_4_ = uVar182;
  auVar103._16_4_ = uVar182;
  auVar103._20_4_ = uVar182;
  auVar103._24_4_ = uVar182;
  auVar103._28_4_ = uVar182;
  auVar102 = vmaxps_avx512vl(auVar102,auVar103);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vpmaxsd_avx2(auVar108,auVar114);
  auVar102 = vpmaxsd_avx2(auVar109,auVar112);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar110,auVar99);
  uVar182 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
  auVar106._4_4_ = uVar182;
  auVar106._0_4_ = uVar182;
  auVar106._8_4_ = uVar182;
  auVar106._12_4_ = uVar182;
  auVar106._16_4_ = uVar182;
  auVar106._20_4_ = uVar182;
  auVar106._24_4_ = uVar182;
  auVar106._28_4_ = uVar182;
  auVar102 = vminps_avx512vl(auVar102,auVar106);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar107);
  uVar16 = vcmpps_avx512vl(local_300,auVar104,2);
  uVar18 = vpcmpgtd_avx512vl(auVar105,_DAT_01fb4ba0);
  local_808 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar18));
  local_820 = &local_3a0;
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_818 = lVar81;
  local_810 = context;
LAB_019d8dcf:
  iVar79 = 1;
  if (local_808 == 0) {
    return;
  }
  lVar20 = 0;
  for (uVar76 = local_808; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  local_808 = local_808 - 1 & local_808;
  fVar2 = *(float *)((long)&context->scene + lVar20 * 4 + 6);
  uVar76 = (ulong)(uint)((int)lVar20 << 6);
  auVar12 = *(undefined1 (*) [16])(lVar81 + uVar76);
  if (local_808 != 0) {
    uVar77 = local_808 - 1 & local_808;
    for (uVar83 = local_808; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar13 = *(undefined1 (*) [16])(lVar81 + 0x10 + uVar76);
  auVar87 = *(undefined1 (*) [16])(lVar81 + 0x20 + uVar76);
  auVar92 = *(undefined1 (*) [16])(lVar81 + 0x30 + uVar76);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x20)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar97 = vinsertps_avx(auVar85,ZEXT416((uint)pre->ray_space[0].vz.field_0.m128[(long)ray]),0x28);
  uVar182 = *(undefined4 *)((long)&pre->ray_space[2].vx.field_0 + (long)ray * 4);
  auVar91._4_4_ = uVar182;
  auVar91._0_4_ = uVar182;
  auVar91._8_4_ = uVar182;
  auVar91._12_4_ = uVar182;
  local_5e0._16_4_ = uVar182;
  local_5e0._0_16_ = auVar91;
  local_5e0._20_4_ = uVar182;
  local_5e0._24_4_ = uVar182;
  local_5e0._28_4_ = uVar182;
  auVar271 = ZEXT3264(local_5e0);
  uVar182 = *(undefined4 *)((long)&pre->ray_space[2].vz.field_0 + (long)ray * 4);
  auVar96._4_4_ = uVar182;
  auVar96._0_4_ = uVar182;
  auVar96._8_4_ = uVar182;
  auVar96._12_4_ = uVar182;
  local_4a0._16_4_ = uVar182;
  local_4a0._0_16_ = auVar96;
  local_4a0._20_4_ = uVar182;
  local_4a0._24_4_ = uVar182;
  local_4a0._28_4_ = uVar182;
  auVar85 = vunpcklps_avx(auVar91,auVar96);
  fVar157 = *(float *)((long)&pre->ray_space[3].vy.field_0 + (long)ray * 4);
  auVar261._4_4_ = fVar157;
  auVar261._0_4_ = fVar157;
  auVar261._8_4_ = fVar157;
  auVar261._12_4_ = fVar157;
  local_600._16_4_ = fVar157;
  local_600._0_16_ = auVar261;
  local_600._20_4_ = fVar157;
  local_600._24_4_ = fVar157;
  local_600._28_4_ = fVar157;
  local_7d0 = vinsertps_avx(auVar85,auVar261,0x28);
  auVar262 = ZEXT1664(local_7d0);
  auVar90._0_4_ = auVar12._0_4_ + auVar13._0_4_ + auVar87._0_4_ + auVar92._0_4_;
  auVar90._4_4_ = auVar12._4_4_ + auVar13._4_4_ + auVar87._4_4_ + auVar92._4_4_;
  auVar90._8_4_ = auVar12._8_4_ + auVar13._8_4_ + auVar87._8_4_ + auVar92._8_4_;
  auVar90._12_4_ = auVar12._12_4_ + auVar13._12_4_ + auVar87._12_4_ + auVar92._12_4_;
  auVar89._8_4_ = 0x3e800000;
  auVar89._0_8_ = 0x3e8000003e800000;
  auVar89._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar90,auVar89);
  auVar85 = vsubps_avx(auVar85,auVar97);
  auVar85 = vdpps_avx(auVar85,local_7d0,0x7f);
  fVar176 = *(float *)((long)&context->scene + 2);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar264 = ZEXT1664(local_7e0);
  fVar174 = pre->ray_space[1].vy.field_0.m128[(long)ray];
  auVar266 = ZEXT464((uint)fVar174);
  auVar94._4_12_ = ZEXT812(0) << 0x20;
  auVar94._0_4_ = local_7e0._0_4_;
  auVar86 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar94);
  auVar93 = vfnmadd213ss_fma(auVar86,local_7e0,ZEXT416(0x40000000));
  local_2e0 = auVar85._0_4_ * auVar86._0_4_ * auVar93._0_4_;
  auVar95._4_4_ = local_2e0;
  auVar95._0_4_ = local_2e0;
  auVar95._8_4_ = local_2e0;
  auVar95._12_4_ = local_2e0;
  fStack_590 = local_2e0;
  _local_5a0 = auVar95;
  fStack_58c = local_2e0;
  fStack_588 = local_2e0;
  fStack_584 = local_2e0;
  auVar85 = vfmadd231ps_fma(auVar97,local_7d0,auVar95);
  auVar85 = vblendps_avx(auVar85,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar85);
  auVar87 = vsubps_avx(auVar87,auVar85);
  auVar253 = ZEXT1664(auVar87);
  auVar13 = vsubps_avx(auVar13,auVar85);
  auVar257 = ZEXT1664(auVar13);
  auVar92 = vsubps_avx(auVar92,auVar85);
  auVar104 = vbroadcastss_avx512vl(auVar12);
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  local_760 = ZEXT1632(auVar12);
  auVar102 = vpermps_avx512vl(auVar122,local_760);
  auVar123._8_4_ = 2;
  auVar123._0_8_ = 0x200000002;
  auVar123._12_4_ = 2;
  auVar123._16_4_ = 2;
  auVar123._20_4_ = 2;
  auVar123._24_4_ = 2;
  auVar123._28_4_ = 2;
  auVar103 = vpermps_avx512vl(auVar123,local_760);
  auVar124._8_4_ = 3;
  auVar124._0_8_ = 0x300000003;
  auVar124._12_4_ = 3;
  auVar124._16_4_ = 3;
  auVar124._20_4_ = 3;
  auVar124._24_4_ = 3;
  auVar124._28_4_ = 3;
  auVar106 = vpermps_avx512vl(auVar124,local_760);
  auVar107 = vbroadcastss_avx512vl(auVar13);
  local_7a0 = ZEXT1632(auVar13);
  auVar105 = vpermps_avx512vl(auVar122,local_7a0);
  auVar108 = vpermps_avx512vl(auVar123,local_7a0);
  auVar109 = vpermps_avx512vl(auVar124,local_7a0);
  auVar110 = vbroadcastss_avx512vl(auVar87);
  local_780 = ZEXT1632(auVar87);
  auVar111 = vpermps_avx512vl(auVar122,local_780);
  auVar100 = vpermps_avx512vl(auVar123,local_780);
  auVar101 = vpermps_avx512vl(auVar124,local_780);
  local_260 = vbroadcastss_avx512vl(auVar92);
  _local_7c0 = ZEXT1632(auVar92);
  local_280 = vpermps_avx2(auVar122,_local_7c0);
  local_240 = vpermps_avx512vl(auVar123,_local_7c0);
  local_2c0 = vpermps_avx2(auVar124,_local_7c0);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar157 * fVar157)),local_4a0,local_4a0);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_5e0,local_5e0);
  local_220._0_4_ = auVar12._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar121);
  local_700 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar174 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4c0 = vpbroadcastd_avx512vl();
  uVar76 = 0;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar12 = vsqrtss_avx(local_7e0,local_7e0);
  auVar13 = vsqrtss_avx(local_7e0,local_7e0);
  local_530 = ZEXT816(0x3f80000000000000);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar274 = ZEXT3264(auVar98);
  auVar247 = ZEXT3264(_DAT_01f7b040);
  local_2a0 = local_240;
  do {
    auVar87 = vmovshdup_avx(local_530);
    auVar87 = vsubps_avx(auVar87,local_530);
    auVar165._0_4_ = auVar87._0_4_;
    fVar15 = auVar165._0_4_ * 0.04761905;
    uVar182 = local_530._0_4_;
    local_860._4_4_ = uVar182;
    local_860._0_4_ = uVar182;
    local_860._8_4_ = uVar182;
    local_860._12_4_ = uVar182;
    local_860._16_4_ = uVar182;
    local_860._20_4_ = uVar182;
    local_860._24_4_ = uVar182;
    local_860._28_4_ = uVar182;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar87 = vfmadd231ps_fma(local_860,auVar165,auVar247._0_32_);
    auVar99 = vsubps_avx512vl(auVar274._0_32_,ZEXT1632(auVar87));
    fVar157 = auVar99._0_4_;
    fVar259 = auVar99._4_4_;
    fVar235 = auVar99._8_4_;
    fVar236 = auVar99._12_4_;
    fVar273 = auVar99._16_4_;
    fVar199 = auVar99._20_4_;
    fVar14 = auVar99._24_4_;
    fVar158 = fVar157 * fVar157 * fVar157;
    fVar175 = fVar259 * fVar259 * fVar259;
    auVar125._4_4_ = fVar175;
    auVar125._0_4_ = fVar158;
    fVar177 = fVar235 * fVar235 * fVar235;
    auVar125._8_4_ = fVar177;
    fVar178 = fVar236 * fVar236 * fVar236;
    auVar125._12_4_ = fVar178;
    fVar179 = fVar273 * fVar273 * fVar273;
    auVar125._16_4_ = fVar179;
    fVar180 = fVar199 * fVar199 * fVar199;
    auVar125._20_4_ = fVar180;
    fVar181 = fVar14 * fVar14 * fVar14;
    auVar125._24_4_ = fVar181;
    auVar125._28_4_ = auVar165._0_4_;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar112 = vmulps_avx512vl(auVar125,auVar98);
    fVar258 = auVar87._0_4_;
    fVar260 = auVar87._4_4_;
    fVar217 = auVar87._8_4_;
    fVar272 = auVar87._12_4_;
    fVar198 = fVar258 * fVar258 * fVar258;
    fVar214 = fVar260 * fVar260 * fVar260;
    fVar215 = fVar217 * fVar217 * fVar217;
    fVar216 = fVar272 * fVar272 * fVar272;
    auVar263._0_4_ = fVar258 * fVar157;
    auVar263._4_4_ = fVar260 * fVar259;
    auVar263._8_4_ = fVar217 * fVar235;
    auVar263._12_4_ = fVar272 * fVar236;
    auVar263._16_4_ = fVar273 * 0.0;
    auVar263._20_4_ = fVar199 * 0.0;
    auVar263._28_36_ = auVar262._28_36_;
    auVar263._24_4_ = fVar14 * 0.0;
    auVar113 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar198)
                                                                  ))),auVar98);
    fVar265 = auVar113._28_4_ + auVar165._0_4_;
    fVar248 = fVar265 + auVar266._28_4_ + auVar247._28_4_;
    auVar126._4_4_ = fVar175 * 0.16666667;
    auVar126._0_4_ = fVar158 * 0.16666667;
    auVar126._8_4_ = fVar177 * 0.16666667;
    auVar126._12_4_ = fVar178 * 0.16666667;
    auVar126._16_4_ = fVar179 * 0.16666667;
    auVar126._20_4_ = fVar180 * 0.16666667;
    auVar126._24_4_ = fVar181 * 0.16666667;
    auVar126._28_4_ = fVar265;
    auVar132._4_4_ =
         (auVar263._4_4_ * fVar259 * 12.0 + auVar263._4_4_ * fVar260 * 6.0 +
         fVar214 + auVar112._4_4_) * 0.16666667;
    auVar132._0_4_ =
         (auVar263._0_4_ * fVar157 * 12.0 + auVar263._0_4_ * fVar258 * 6.0 +
         fVar198 + auVar112._0_4_) * 0.16666667;
    auVar132._8_4_ =
         (auVar263._8_4_ * fVar235 * 12.0 + auVar263._8_4_ * fVar217 * 6.0 +
         fVar215 + auVar112._8_4_) * 0.16666667;
    auVar132._12_4_ =
         (auVar263._12_4_ * fVar236 * 12.0 + auVar263._12_4_ * fVar272 * 6.0 +
         fVar216 + auVar112._12_4_) * 0.16666667;
    auVar132._16_4_ =
         (auVar263._16_4_ * fVar273 * 12.0 + auVar263._16_4_ * 0.0 * 6.0 + auVar112._16_4_ + 0.0) *
         0.16666667;
    auVar132._20_4_ =
         (auVar263._20_4_ * fVar199 * 12.0 + auVar263._20_4_ * 0.0 * 6.0 + auVar112._20_4_ + 0.0) *
         0.16666667;
    auVar132._24_4_ =
         (auVar263._24_4_ * fVar14 * 12.0 + auVar263._24_4_ * 0.0 * 6.0 + auVar112._24_4_ + 0.0) *
         0.16666667;
    auVar132._28_4_ = auVar266._28_4_;
    auVar133._4_4_ =
         (auVar113._4_4_ + fVar175 +
         auVar263._4_4_ * fVar260 * 12.0 + auVar263._4_4_ * fVar259 * 6.0) * 0.16666667;
    auVar133._0_4_ =
         (auVar113._0_4_ + fVar158 +
         auVar263._0_4_ * fVar258 * 12.0 + auVar263._0_4_ * fVar157 * 6.0) * 0.16666667;
    auVar133._8_4_ =
         (auVar113._8_4_ + fVar177 +
         auVar263._8_4_ * fVar217 * 12.0 + auVar263._8_4_ * fVar235 * 6.0) * 0.16666667;
    auVar133._12_4_ =
         (auVar113._12_4_ + fVar178 +
         auVar263._12_4_ * fVar272 * 12.0 + auVar263._12_4_ * fVar236 * 6.0) * 0.16666667;
    auVar133._16_4_ =
         (auVar113._16_4_ + fVar179 + auVar263._16_4_ * 0.0 * 12.0 + auVar263._16_4_ * fVar273 * 6.0
         ) * 0.16666667;
    auVar133._20_4_ =
         (auVar113._20_4_ + fVar180 + auVar263._20_4_ * 0.0 * 12.0 + auVar263._20_4_ * fVar199 * 6.0
         ) * 0.16666667;
    auVar133._24_4_ =
         (auVar113._24_4_ + fVar181 + auVar263._24_4_ * 0.0 * 12.0 + auVar263._24_4_ * fVar14 * 6.0)
         * 0.16666667;
    auVar133._28_4_ = auVar271._28_4_;
    fVar198 = fVar198 * 0.16666667;
    fVar214 = fVar214 * 0.16666667;
    fVar215 = fVar215 * 0.16666667;
    fVar216 = fVar216 * 0.16666667;
    auVar134._28_4_ = fVar248;
    auVar134._0_28_ = ZEXT1628(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar198))));
    auVar113 = vmulps_avx512vl(local_260,auVar134);
    auVar135._4_4_ = local_280._4_4_ * fVar214;
    auVar135._0_4_ = local_280._0_4_ * fVar198;
    auVar135._8_4_ = local_280._8_4_ * fVar215;
    auVar135._12_4_ = local_280._12_4_ * fVar216;
    auVar135._16_4_ = local_280._16_4_ * 0.0;
    auVar135._20_4_ = local_280._20_4_ * 0.0;
    auVar135._24_4_ = local_280._24_4_ * 0.0;
    auVar135._28_4_ = auVar264._28_4_ + auVar271._28_4_ + auVar112._28_4_ + 0.0;
    auVar112 = vmulps_avx512vl(local_2a0,auVar134);
    auVar136._4_4_ = local_2c0._4_4_ * fVar214;
    auVar136._0_4_ = local_2c0._0_4_ * fVar198;
    auVar136._8_4_ = local_2c0._8_4_ * fVar215;
    auVar136._12_4_ = local_2c0._12_4_ * fVar216;
    auVar136._16_4_ = local_2c0._16_4_ * 0.0;
    auVar136._20_4_ = local_2c0._20_4_ * 0.0;
    auVar136._24_4_ = local_2c0._24_4_ * 0.0;
    auVar136._28_4_ = fVar248;
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar133,auVar110);
    auVar114 = vfmadd231ps_avx512vl(auVar135,auVar133,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar133,auVar100);
    auVar115 = vfmadd231ps_avx512vl(auVar136,auVar101,auVar133);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar132,auVar107);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar132,auVar105);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar132,auVar108);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar109,auVar132);
    auVar116 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar104);
    auVar117 = vfmadd231ps_avx512vl(auVar114,auVar126,auVar102);
    auVar118 = vfmadd231ps_avx512vl(auVar112,auVar126,auVar103);
    auVar112 = vfmadd231ps_avx512vl(auVar115,auVar106,auVar126);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar113 = vxorps_avx512vl(auVar99,auVar119);
    auVar114 = vxorps_avx512vl(ZEXT1632(auVar87),auVar119);
    auVar239._0_4_ = auVar114._0_4_ * fVar258;
    auVar239._4_4_ = auVar114._4_4_ * fVar260;
    auVar239._8_4_ = auVar114._8_4_ * fVar217;
    auVar239._12_4_ = auVar114._12_4_ * fVar272;
    auVar239._16_4_ = auVar114._16_4_ * 0.0;
    auVar239._20_4_ = auVar114._20_4_ * 0.0;
    auVar239._24_4_ = auVar114._24_4_ * 0.0;
    auVar239._28_4_ = 0;
    auVar115 = vmulps_avx512vl(auVar263._0_32_,auVar98);
    auVar98 = vsubps_avx(auVar239,auVar115);
    auVar139._4_4_ = auVar113._4_4_ * fVar259 * 0.5;
    auVar139._0_4_ = auVar113._0_4_ * fVar157 * 0.5;
    auVar139._8_4_ = auVar113._8_4_ * fVar235 * 0.5;
    auVar139._12_4_ = auVar113._12_4_ * fVar236 * 0.5;
    auVar139._16_4_ = auVar113._16_4_ * fVar273 * 0.5;
    auVar139._20_4_ = auVar113._20_4_ * fVar199 * 0.5;
    auVar139._24_4_ = auVar113._24_4_ * fVar14 * 0.5;
    auVar139._28_4_ = auVar99._28_4_;
    auVar140._4_4_ = auVar98._4_4_ * 0.5;
    auVar140._0_4_ = auVar98._0_4_ * 0.5;
    auVar140._8_4_ = auVar98._8_4_ * 0.5;
    auVar140._12_4_ = auVar98._12_4_ * 0.5;
    auVar140._16_4_ = auVar98._16_4_ * 0.5;
    auVar140._20_4_ = auVar98._20_4_ * 0.5;
    auVar140._24_4_ = auVar98._24_4_ * 0.5;
    auVar140._28_4_ = auVar98._28_4_;
    auVar34._4_4_ = (auVar115._4_4_ + fVar259 * fVar259) * 0.5;
    auVar34._0_4_ = (auVar115._0_4_ + fVar157 * fVar157) * 0.5;
    auVar34._8_4_ = (auVar115._8_4_ + fVar235 * fVar235) * 0.5;
    auVar34._12_4_ = (auVar115._12_4_ + fVar236 * fVar236) * 0.5;
    auVar34._16_4_ = (auVar115._16_4_ + fVar273 * fVar273) * 0.5;
    auVar34._20_4_ = (auVar115._20_4_ + fVar199 * fVar199) * 0.5;
    auVar34._24_4_ = (auVar115._24_4_ + fVar14 * fVar14) * 0.5;
    auVar34._28_4_ = auVar115._28_4_ + auVar253._28_4_;
    fVar157 = fVar258 * fVar258 * 0.5;
    fVar258 = fVar260 * fVar260 * 0.5;
    fVar259 = fVar217 * fVar217 * 0.5;
    fVar260 = fVar272 * fVar272 * 0.5;
    auVar35._28_4_ = auVar257._28_4_;
    auVar35._0_28_ = ZEXT1628(CONCAT412(fVar260,CONCAT48(fVar259,CONCAT44(fVar258,fVar157))));
    auVar98 = vmulps_avx512vl(local_260,auVar35);
    auVar36._4_4_ = local_280._4_4_ * fVar258;
    auVar36._0_4_ = local_280._0_4_ * fVar157;
    auVar36._8_4_ = local_280._8_4_ * fVar259;
    auVar36._12_4_ = local_280._12_4_ * fVar260;
    auVar36._16_4_ = local_280._16_4_ * 0.0;
    auVar36._20_4_ = local_280._20_4_ * 0.0;
    auVar36._24_4_ = local_280._24_4_ * 0.0;
    auVar36._28_4_ = auVar114._28_4_;
    auVar99 = vmulps_avx512vl(local_2a0,auVar35);
    auVar37._4_4_ = fVar258 * local_2c0._4_4_;
    auVar37._0_4_ = fVar157 * local_2c0._0_4_;
    auVar37._8_4_ = fVar259 * local_2c0._8_4_;
    auVar37._12_4_ = fVar260 * local_2c0._12_4_;
    auVar37._16_4_ = local_2c0._16_4_ * 0.0;
    auVar37._20_4_ = local_2c0._20_4_ * 0.0;
    auVar37._24_4_ = local_2c0._24_4_ * 0.0;
    auVar37._28_4_ = auVar257._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar34,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar36,auVar34,auVar111);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar34,auVar100);
    auVar87 = vfmadd231ps_fma(auVar37,auVar101,auVar34);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar140,auVar107);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar140,auVar105);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar140,auVar108);
    auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar109,auVar140);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar139,auVar104);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar139,auVar102);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar139,auVar103);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar106,auVar139);
    auVar38._4_4_ = auVar98._4_4_ * fVar15;
    auVar38._0_4_ = auVar98._0_4_ * fVar15;
    auVar38._8_4_ = auVar98._8_4_ * fVar15;
    auVar38._12_4_ = auVar98._12_4_ * fVar15;
    auVar38._16_4_ = auVar98._16_4_ * fVar15;
    auVar38._20_4_ = auVar98._20_4_ * fVar15;
    auVar38._24_4_ = auVar98._24_4_ * fVar15;
    auVar38._28_4_ = auVar101._28_4_;
    auVar271 = ZEXT3264(auVar38);
    auVar39._4_4_ = auVar113._4_4_ * fVar15;
    auVar39._0_4_ = auVar113._0_4_ * fVar15;
    auVar39._8_4_ = auVar113._8_4_ * fVar15;
    auVar39._12_4_ = auVar113._12_4_ * fVar15;
    auVar39._16_4_ = auVar113._16_4_ * fVar15;
    auVar39._20_4_ = auVar113._20_4_ * fVar15;
    auVar39._24_4_ = auVar113._24_4_ * fVar15;
    auVar39._28_4_ = 0x3e2aaaab;
    auVar40._4_4_ = auVar99._4_4_ * fVar15;
    auVar40._0_4_ = auVar99._0_4_ * fVar15;
    auVar40._8_4_ = auVar99._8_4_ * fVar15;
    auVar40._12_4_ = auVar99._12_4_ * fVar15;
    auVar40._16_4_ = auVar99._16_4_ * fVar15;
    auVar40._20_4_ = auVar99._20_4_ * fVar15;
    auVar40._24_4_ = auVar99._24_4_ * fVar15;
    auVar40._28_4_ = 0x40c00000;
    fVar157 = auVar114._0_4_ * fVar15;
    fVar258 = auVar114._4_4_ * fVar15;
    auVar41._4_4_ = fVar258;
    auVar41._0_4_ = fVar157;
    fVar259 = auVar114._8_4_ * fVar15;
    auVar41._8_4_ = fVar259;
    fVar260 = auVar114._12_4_ * fVar15;
    auVar41._12_4_ = fVar260;
    fVar235 = auVar114._16_4_ * fVar15;
    auVar41._16_4_ = fVar235;
    fVar217 = auVar114._20_4_ * fVar15;
    auVar41._20_4_ = fVar217;
    fVar236 = auVar114._24_4_ * fVar15;
    auVar41._24_4_ = fVar236;
    auVar41._28_4_ = fVar15;
    auVar87 = vxorps_avx512vl(auVar274._0_16_,auVar274._0_16_);
    auVar120 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,ZEXT1632(auVar87));
    auVar262 = ZEXT3264(auVar120);
    auVar121 = vpermt2ps_avx512vl(auVar117,_DAT_01fb9fc0,ZEXT1632(auVar87));
    auVar264 = ZEXT3264(auVar121);
    auVar113 = ZEXT1632(auVar87);
    auVar122 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,auVar113);
    auVar266 = ZEXT3264(auVar122);
    auVar240._0_4_ = fVar157 + auVar112._0_4_;
    auVar240._4_4_ = fVar258 + auVar112._4_4_;
    auVar240._8_4_ = fVar259 + auVar112._8_4_;
    auVar240._12_4_ = fVar260 + auVar112._12_4_;
    auVar240._16_4_ = fVar235 + auVar112._16_4_;
    auVar240._20_4_ = fVar217 + auVar112._20_4_;
    auVar240._24_4_ = fVar236 + auVar112._24_4_;
    auVar240._28_4_ = fVar15 + auVar112._28_4_;
    auVar98 = vmaxps_avx(auVar112,auVar240);
    auVar99 = vminps_avx(auVar112,auVar240);
    auVar123 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,auVar113);
    auVar124 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar113);
    auVar125 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar113);
    auVar139 = ZEXT1632(auVar87);
    auVar126 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar139);
    auVar112 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar139);
    auVar127 = vsubps_avx512vl(auVar123,auVar112);
    auVar112 = vsubps_avx(auVar120,auVar116);
    auVar257 = ZEXT3264(auVar112);
    auVar113 = vsubps_avx(auVar121,auVar117);
    auVar253 = ZEXT3264(auVar113);
    auVar114 = vsubps_avx(auVar122,auVar118);
    auVar115 = vmulps_avx512vl(auVar113,auVar40);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar39,auVar114);
    auVar128 = vmulps_avx512vl(auVar114,auVar38);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar40,auVar112);
    auVar129 = vmulps_avx512vl(auVar112,auVar39);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar38,auVar113);
    auVar129 = vmulps_avx512vl(auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar115,auVar115);
    auVar115 = vmulps_avx512vl(auVar114,auVar114);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar113);
    auVar130 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
    auVar129 = vrcp14ps_avx512vl(auVar130);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar131 = vfnmadd213ps_avx512vl(auVar129,auVar130,auVar115);
    auVar129 = vfmadd132ps_avx512vl(auVar131,auVar129,auVar129);
    auVar128 = vmulps_avx512vl(auVar128,auVar129);
    auVar131 = vmulps_avx512vl(auVar113,auVar126);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar125,auVar114);
    auVar132 = vmulps_avx512vl(auVar114,auVar124);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar126,auVar112);
    auVar133 = vmulps_avx512vl(auVar112,auVar125);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar124,auVar113);
    auVar133 = vmulps_avx512vl(auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar129 = vmulps_avx512vl(auVar131,auVar129);
    auVar128 = vmaxps_avx512vl(auVar128,auVar129);
    auVar128 = vsqrtps_avx512vl(auVar128);
    auVar129 = vmaxps_avx512vl(auVar127,auVar123);
    auVar98 = vmaxps_avx512vl(auVar98,auVar129);
    auVar131 = vaddps_avx512vl(auVar128,auVar98);
    auVar98 = vminps_avx512vl(auVar127,auVar123);
    auVar98 = vminps_avx(auVar99,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar128);
    auVar127._8_4_ = 0x3f800002;
    auVar127._0_8_ = 0x3f8000023f800002;
    auVar127._12_4_ = 0x3f800002;
    auVar127._16_4_ = 0x3f800002;
    auVar127._20_4_ = 0x3f800002;
    auVar127._24_4_ = 0x3f800002;
    auVar127._28_4_ = 0x3f800002;
    auVar99 = vmulps_avx512vl(auVar131,auVar127);
    auVar128._8_4_ = 0x3f7ffffc;
    auVar128._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar128._12_4_ = 0x3f7ffffc;
    auVar128._16_4_ = 0x3f7ffffc;
    auVar128._20_4_ = 0x3f7ffffc;
    auVar128._24_4_ = 0x3f7ffffc;
    auVar128._28_4_ = 0x3f7ffffc;
    auVar98 = vmulps_avx512vl(auVar98,auVar128);
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar123 = vrsqrt14ps_avx512vl(auVar130);
    auVar129._8_4_ = 0xbf000000;
    auVar129._0_8_ = 0xbf000000bf000000;
    auVar129._12_4_ = 0xbf000000;
    auVar129._16_4_ = 0xbf000000;
    auVar129._20_4_ = 0xbf000000;
    auVar129._24_4_ = 0xbf000000;
    auVar129._28_4_ = 0xbf000000;
    auVar127 = vmulps_avx512vl(auVar130,auVar129);
    fVar157 = auVar123._0_4_;
    fVar258 = auVar123._4_4_;
    fVar259 = auVar123._8_4_;
    fVar260 = auVar123._12_4_;
    fVar235 = auVar123._16_4_;
    fVar217 = auVar123._20_4_;
    fVar236 = auVar123._24_4_;
    auVar42._4_4_ = fVar258 * fVar258 * fVar258 * auVar127._4_4_;
    auVar42._0_4_ = fVar157 * fVar157 * fVar157 * auVar127._0_4_;
    auVar42._8_4_ = fVar259 * fVar259 * fVar259 * auVar127._8_4_;
    auVar42._12_4_ = fVar260 * fVar260 * fVar260 * auVar127._12_4_;
    auVar42._16_4_ = fVar235 * fVar235 * fVar235 * auVar127._16_4_;
    auVar42._20_4_ = fVar217 * fVar217 * fVar217 * auVar127._20_4_;
    auVar42._24_4_ = fVar236 * fVar236 * fVar236 * auVar127._24_4_;
    auVar42._28_4_ = auVar131._28_4_;
    auVar130._8_4_ = 0x3fc00000;
    auVar130._0_8_ = 0x3fc000003fc00000;
    auVar130._12_4_ = 0x3fc00000;
    auVar130._16_4_ = 0x3fc00000;
    auVar130._20_4_ = 0x3fc00000;
    auVar130._24_4_ = 0x3fc00000;
    auVar130._28_4_ = 0x3fc00000;
    auVar123 = vfmadd231ps_avx512vl(auVar42,auVar123,auVar130);
    auVar127 = vmulps_avx512vl(auVar112,auVar123);
    auVar128 = vmulps_avx512vl(auVar113,auVar123);
    auVar129 = vmulps_avx512vl(auVar114,auVar123);
    auVar130 = vsubps_avx512vl(auVar139,auVar116);
    auVar132 = vsubps_avx512vl(auVar139,auVar117);
    auVar133 = vsubps_avx512vl(auVar139,auVar118);
    auVar131 = vmulps_avx512vl(local_600,auVar133);
    auVar131 = vfmadd231ps_avx512vl(auVar131,local_4a0,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar131,local_5e0,auVar130);
    auVar134 = vmulps_avx512vl(auVar133,auVar133);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar132,auVar132);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar130,auVar130);
    auVar135 = vmulps_avx512vl(local_600,auVar129);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar128,local_4a0);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar127,local_5e0);
    auVar129 = vmulps_avx512vl(auVar133,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar132,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar130,auVar127);
    auVar128 = vmulps_avx512vl(auVar135,auVar135);
    auVar129 = vsubps_avx512vl(local_220,auVar128);
    auVar136 = vmulps_avx512vl(auVar135,auVar127);
    auVar131 = vsubps_avx512vl(auVar131,auVar136);
    auVar136 = vaddps_avx512vl(auVar131,auVar131);
    auVar131 = vmulps_avx512vl(auVar127,auVar127);
    local_800 = vsubps_avx512vl(auVar134,auVar131);
    auVar99 = vsubps_avx512vl(local_800,auVar99);
    local_740 = vmulps_avx512vl(auVar136,auVar136);
    auVar131._8_4_ = 0x40800000;
    auVar131._0_8_ = 0x4080000040800000;
    auVar131._12_4_ = 0x40800000;
    auVar131._16_4_ = 0x40800000;
    auVar131._20_4_ = 0x40800000;
    auVar131._24_4_ = 0x40800000;
    auVar131._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar129,auVar131);
    auVar131 = vmulps_avx512vl(_local_880,auVar99);
    auVar131 = vsubps_avx512vl(local_740,auVar131);
    uVar83 = vcmpps_avx512vl(auVar131,auVar139,5);
    bVar72 = (byte)uVar83;
    if (bVar72 == 0) {
LAB_019d9b06:
      auVar274 = ZEXT3264(auVar115);
      auVar247 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      auVar131 = vsqrtps_avx512vl(auVar131);
      auVar134 = vaddps_avx512vl(auVar129,auVar129);
      local_8a0 = vrcp14ps_avx512vl(auVar134);
      auVar115 = vfnmadd213ps_avx512vl(local_8a0,auVar134,auVar115);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_8a0,local_8a0);
      _local_640 = vxorps_avx512vl(auVar136,auVar119);
      auVar119 = vsubps_avx512vl(_local_640,auVar131);
      local_620 = vmulps_avx512vl(auVar119,auVar115);
      auVar119 = vsubps_avx512vl(auVar131,auVar136);
      local_660 = vmulps_avx512vl(auVar119,auVar115);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar115,local_620);
      auVar137._0_4_ =
           (uint)(bVar72 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar115._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar137._4_4_ = (uint)bVar82 * auVar119._4_4_ | (uint)!bVar82 * auVar115._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar137._8_4_ = (uint)bVar82 * auVar119._8_4_ | (uint)!bVar82 * auVar115._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar137._12_4_ = (uint)bVar82 * auVar119._12_4_ | (uint)!bVar82 * auVar115._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar137._16_4_ = (uint)bVar82 * auVar119._16_4_ | (uint)!bVar82 * auVar115._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar137._20_4_ = (uint)bVar82 * auVar119._20_4_ | (uint)!bVar82 * auVar115._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar137._24_4_ = (uint)bVar82 * auVar119._24_4_ | (uint)!bVar82 * auVar115._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar137._28_4_ = (uint)bVar82 * auVar119._28_4_ | (uint)!bVar82 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar115,local_660);
      auVar138._0_4_ =
           (uint)(bVar72 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar115._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar138._4_4_ = (uint)bVar82 * auVar119._4_4_ | (uint)!bVar82 * auVar115._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar138._8_4_ = (uint)bVar82 * auVar119._8_4_ | (uint)!bVar82 * auVar115._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar138._12_4_ = (uint)bVar82 * auVar119._12_4_ | (uint)!bVar82 * auVar115._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar138._16_4_ = (uint)bVar82 * auVar119._16_4_ | (uint)!bVar82 * auVar115._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar138._20_4_ = (uint)bVar82 * auVar119._20_4_ | (uint)!bVar82 * auVar115._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar138._24_4_ = (uint)bVar82 * auVar119._24_4_ | (uint)!bVar82 * auVar115._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar138._28_4_ = (uint)bVar82 * auVar119._28_4_ | (uint)!bVar82 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar128,auVar115);
      local_680 = vmaxps_avx512vl(local_240,auVar115);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_6a0 = vmulps_avx512vl(local_680,auVar27);
      vandps_avx512vl(auVar129,auVar115);
      uVar77 = vcmpps_avx512vl(local_6a0,local_6a0,1);
      uVar83 = uVar83 & uVar77;
      bVar80 = (byte)uVar83;
      if (bVar80 != 0) {
        uVar77 = vcmpps_avx512vl(auVar99,_DAT_01f7b000,2);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar119 = vblendmps_avx512vl(auVar99,auVar115);
        bVar78 = (byte)uVar77;
        uVar84 = (uint)(bVar78 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar78 & 1) * local_6a0._0_4_;
        bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar150 = (uint)bVar82 * auVar119._4_4_ | (uint)!bVar82 * local_6a0._4_4_;
        bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar151 = (uint)bVar82 * auVar119._8_4_ | (uint)!bVar82 * local_6a0._8_4_;
        bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar152 = (uint)bVar82 * auVar119._12_4_ | (uint)!bVar82 * local_6a0._12_4_;
        bVar82 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar153 = (uint)bVar82 * auVar119._16_4_ | (uint)!bVar82 * local_6a0._16_4_;
        bVar82 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar154 = (uint)bVar82 * auVar119._20_4_ | (uint)!bVar82 * local_6a0._20_4_;
        bVar82 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar155 = (uint)bVar82 * auVar119._24_4_ | (uint)!bVar82 * local_6a0._24_4_;
        bVar82 = SUB81(uVar77 >> 7,0);
        uVar156 = (uint)bVar82 * auVar119._28_4_ | (uint)!bVar82 * local_6a0._28_4_;
        auVar137._0_4_ = (bVar80 & 1) * uVar84 | !(bool)(bVar80 & 1) * auVar137._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar137._4_4_ = bVar82 * uVar150 | !bVar82 * auVar137._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar137._8_4_ = bVar82 * uVar151 | !bVar82 * auVar137._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar137._12_4_ = bVar82 * uVar152 | !bVar82 * auVar137._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar137._16_4_ = bVar82 * uVar153 | !bVar82 * auVar137._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar137._20_4_ = bVar82 * uVar154 | !bVar82 * auVar137._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar137._24_4_ = bVar82 * uVar155 | !bVar82 * auVar137._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar137._28_4_ = bVar82 * uVar156 | !bVar82 * auVar137._28_4_;
        auVar99 = vblendmps_avx512vl(auVar115,auVar99);
        bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar11 = SUB81(uVar77 >> 7,0);
        auVar138._0_4_ =
             (uint)(bVar80 & 1) *
             ((uint)(bVar78 & 1) * auVar99._0_4_ | !(bool)(bVar78 & 1) * uVar84) |
             !(bool)(bVar80 & 1) * auVar138._0_4_;
        bVar5 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar138._4_4_ =
             (uint)bVar5 * ((uint)bVar82 * auVar99._4_4_ | !bVar82 * uVar150) |
             !bVar5 * auVar138._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar138._8_4_ =
             (uint)bVar82 * ((uint)bVar6 * auVar99._8_4_ | !bVar6 * uVar151) |
             !bVar82 * auVar138._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar138._12_4_ =
             (uint)bVar82 * ((uint)bVar7 * auVar99._12_4_ | !bVar7 * uVar152) |
             !bVar82 * auVar138._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar138._16_4_ =
             (uint)bVar82 * ((uint)bVar8 * auVar99._16_4_ | !bVar8 * uVar153) |
             !bVar82 * auVar138._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar138._20_4_ =
             (uint)bVar82 * ((uint)bVar9 * auVar99._20_4_ | !bVar9 * uVar154) |
             !bVar82 * auVar138._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar138._24_4_ =
             (uint)bVar82 * ((uint)bVar10 * auVar99._24_4_ | !bVar10 * uVar155) |
             !bVar82 * auVar138._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar138._28_4_ =
             (uint)bVar82 * ((uint)bVar11 * auVar99._28_4_ | !bVar11 * uVar156) |
             !bVar82 * auVar138._28_4_;
        bVar72 = (~bVar80 | bVar78) & bVar72;
      }
      if ((bVar72 & 0x7f) == 0) {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar274 = ZEXT3264(auVar98);
        auVar247 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar119 = vxorps_avx512vl(auVar126,auVar99);
        auVar124 = vxorps_avx512vl(auVar124,auVar99);
        uVar84 = *(uint *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
        auVar247 = ZEXT464(uVar84);
        auVar128 = vxorps_avx512vl(auVar125,auVar99);
        auVar87 = vsubss_avx512f(ZEXT416(uVar84),ZEXT416((uint)local_700._0_4_));
        auVar115 = vbroadcastss_avx512vl(auVar87);
        auVar129 = vminps_avx512vl(auVar115,auVar138);
        auVar71._4_4_ = fStack_2dc;
        auVar71._0_4_ = local_2e0;
        auVar71._8_4_ = fStack_2d8;
        auVar71._12_4_ = fStack_2d4;
        auVar71._16_4_ = fStack_2d0;
        auVar71._20_4_ = fStack_2cc;
        auVar71._24_4_ = fStack_2c8;
        auVar71._28_4_ = fStack_2c4;
        auVar131 = vmaxps_avx512vl(auVar71,auVar137);
        auVar115 = vmulps_avx512vl(auVar40,auVar133);
        auVar115 = vfmadd213ps_avx512vl(auVar132,auVar39,auVar115);
        auVar87 = vfmadd213ps_fma(auVar130,auVar38,auVar115);
        auVar115 = vmulps_avx512vl(local_600,auVar40);
        auVar115 = vfmadd231ps_avx512vl(auVar115,local_4a0,auVar39);
        auVar130 = vfmadd231ps_avx512vl(auVar115,local_5e0,auVar38);
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar130,auVar125);
        auVar126 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar125,auVar126,1);
        auVar132 = vxorps_avx512vl(ZEXT1632(auVar87),auVar99);
        auVar133 = vrcp14ps_avx512vl(auVar130);
        auVar139 = vxorps_avx512vl(auVar130,auVar99);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar140 = vfnmadd213ps_avx512vl(auVar133,auVar130,auVar115);
        auVar87 = vfmadd132ps_fma(auVar140,auVar133,auVar133);
        fVar157 = auVar87._0_4_ * auVar132._0_4_;
        fVar258 = auVar87._4_4_ * auVar132._4_4_;
        auVar43._4_4_ = fVar258;
        auVar43._0_4_ = fVar157;
        fVar259 = auVar87._8_4_ * auVar132._8_4_;
        auVar43._8_4_ = fVar259;
        fVar260 = auVar87._12_4_ * auVar132._12_4_;
        auVar43._12_4_ = fVar260;
        fVar235 = auVar132._16_4_ * 0.0;
        auVar43._16_4_ = fVar235;
        fVar217 = auVar132._20_4_ * 0.0;
        auVar43._20_4_ = fVar217;
        fVar236 = auVar132._24_4_ * 0.0;
        auVar43._24_4_ = fVar236;
        auVar43._28_4_ = auVar132._28_4_;
        uVar18 = vcmpps_avx512vl(auVar130,auVar139,1);
        bVar80 = (byte)uVar16 | (byte)uVar18;
        auVar269._8_4_ = 0xff800000;
        auVar269._0_8_ = 0xff800000ff800000;
        auVar269._12_4_ = 0xff800000;
        auVar269._16_4_ = 0xff800000;
        auVar269._20_4_ = 0xff800000;
        auVar269._24_4_ = 0xff800000;
        auVar269._28_4_ = 0xff800000;
        auVar133 = vblendmps_avx512vl(auVar43,auVar269);
        auVar141._0_4_ = (uint)(bVar80 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar80 & 1) * -0x800000
        ;
        bVar82 = (bool)(bVar80 >> 1 & 1);
        auVar141._4_4_ = (uint)bVar82 * auVar133._4_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)(bVar80 >> 2 & 1);
        auVar141._8_4_ = (uint)bVar82 * auVar133._8_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)(bVar80 >> 3 & 1);
        auVar141._12_4_ = (uint)bVar82 * auVar133._12_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)(bVar80 >> 4 & 1);
        auVar141._16_4_ = (uint)bVar82 * auVar133._16_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)(bVar80 >> 5 & 1);
        auVar141._20_4_ = (uint)bVar82 * auVar133._20_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)(bVar80 >> 6 & 1);
        auVar141._24_4_ = (uint)bVar82 * auVar133._24_4_ | (uint)!bVar82 * -0x800000;
        auVar141._28_4_ =
             (uint)(bVar80 >> 7) * auVar133._28_4_ | (uint)!(bool)(bVar80 >> 7) * -0x800000;
        auVar133 = vmaxps_avx512vl(auVar131,auVar141);
        auVar271 = ZEXT3264(auVar133);
        uVar18 = vcmpps_avx512vl(auVar130,auVar139,6);
        bVar80 = (byte)uVar16 | (byte)uVar18;
        auVar142._0_4_ = (uint)(bVar80 & 1) * 0x7f800000 | (uint)!(bool)(bVar80 & 1) * (int)fVar157;
        bVar82 = (bool)(bVar80 >> 1 & 1);
        auVar142._4_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar258;
        bVar82 = (bool)(bVar80 >> 2 & 1);
        auVar142._8_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar259;
        bVar82 = (bool)(bVar80 >> 3 & 1);
        auVar142._12_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar260;
        bVar82 = (bool)(bVar80 >> 4 & 1);
        auVar142._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar235;
        bVar82 = (bool)(bVar80 >> 5 & 1);
        auVar142._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar217;
        bVar82 = (bool)(bVar80 >> 6 & 1);
        auVar142._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar236;
        auVar142._28_4_ =
             (uint)(bVar80 >> 7) * 0x7f800000 | (uint)!(bool)(bVar80 >> 7) * auVar132._28_4_;
        auVar129 = vminps_avx512vl(auVar129,auVar142);
        auVar87 = vxorps_avx512vl(auVar131._0_16_,auVar131._0_16_);
        auVar120 = vsubps_avx512vl(ZEXT1632(auVar87),auVar120);
        auVar121 = vsubps_avx512vl(ZEXT1632(auVar87),auVar121);
        auVar130 = ZEXT1632(auVar87);
        auVar122 = vsubps_avx512vl(auVar130,auVar122);
        auVar122 = vmulps_avx512vl(auVar122,auVar119);
        auVar121 = vfmadd231ps_avx512vl(auVar122,auVar128,auVar121);
        auVar120 = vfmadd231ps_avx512vl(auVar121,auVar124,auVar120);
        auVar119 = vmulps_avx512vl(local_600,auVar119);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_4a0,auVar128);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_5e0,auVar124);
        vandps_avx512vl(auVar119,auVar125);
        uVar16 = vcmpps_avx512vl(auVar119,auVar126,1);
        auVar120 = vxorps_avx512vl(auVar120,auVar99);
        auVar121 = vrcp14ps_avx512vl(auVar119);
        auVar99 = vxorps_avx512vl(auVar119,auVar99);
        auVar266 = ZEXT3264(auVar99);
        auVar122 = vfnmadd213ps_avx512vl(auVar121,auVar119,auVar115);
        auVar87 = vfmadd132ps_fma(auVar122,auVar121,auVar121);
        fVar157 = auVar87._0_4_ * auVar120._0_4_;
        fVar258 = auVar87._4_4_ * auVar120._4_4_;
        auVar44._4_4_ = fVar258;
        auVar44._0_4_ = fVar157;
        fVar259 = auVar87._8_4_ * auVar120._8_4_;
        auVar44._8_4_ = fVar259;
        fVar260 = auVar87._12_4_ * auVar120._12_4_;
        auVar44._12_4_ = fVar260;
        fVar235 = auVar120._16_4_ * 0.0;
        auVar44._16_4_ = fVar235;
        fVar217 = auVar120._20_4_ * 0.0;
        auVar44._20_4_ = fVar217;
        fVar236 = auVar120._24_4_ * 0.0;
        auVar44._24_4_ = fVar236;
        auVar44._28_4_ = auVar120._28_4_;
        uVar18 = vcmpps_avx512vl(auVar119,auVar99,1);
        bVar80 = (byte)uVar16 | (byte)uVar18;
        auVar28._8_4_ = 0xff800000;
        auVar28._0_8_ = 0xff800000ff800000;
        auVar28._12_4_ = 0xff800000;
        auVar28._16_4_ = 0xff800000;
        auVar28._20_4_ = 0xff800000;
        auVar28._24_4_ = 0xff800000;
        auVar28._28_4_ = 0xff800000;
        auVar122 = vblendmps_avx512vl(auVar44,auVar28);
        auVar143._0_4_ =
             (uint)(bVar80 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar121._0_4_;
        bVar82 = (bool)(bVar80 >> 1 & 1);
        auVar143._4_4_ = (uint)bVar82 * auVar122._4_4_ | (uint)!bVar82 * auVar121._4_4_;
        bVar82 = (bool)(bVar80 >> 2 & 1);
        auVar143._8_4_ = (uint)bVar82 * auVar122._8_4_ | (uint)!bVar82 * auVar121._8_4_;
        bVar82 = (bool)(bVar80 >> 3 & 1);
        auVar143._12_4_ = (uint)bVar82 * auVar122._12_4_ | (uint)!bVar82 * auVar121._12_4_;
        bVar82 = (bool)(bVar80 >> 4 & 1);
        auVar143._16_4_ = (uint)bVar82 * auVar122._16_4_ | (uint)!bVar82 * auVar121._16_4_;
        bVar82 = (bool)(bVar80 >> 5 & 1);
        auVar143._20_4_ = (uint)bVar82 * auVar122._20_4_ | (uint)!bVar82 * auVar121._20_4_;
        bVar82 = (bool)(bVar80 >> 6 & 1);
        auVar143._24_4_ = (uint)bVar82 * auVar122._24_4_ | (uint)!bVar82 * auVar121._24_4_;
        auVar143._28_4_ =
             (uint)(bVar80 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar121._28_4_;
        local_5c0 = vmaxps_avx(auVar133,auVar143);
        auVar264 = ZEXT3264(local_5c0);
        uVar18 = vcmpps_avx512vl(auVar119,auVar99,6);
        bVar80 = (byte)uVar16 | (byte)uVar18;
        auVar144._0_4_ = (uint)(bVar80 & 1) * 0x7f800000 | (uint)!(bool)(bVar80 & 1) * (int)fVar157;
        bVar82 = (bool)(bVar80 >> 1 & 1);
        auVar144._4_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar258;
        bVar82 = (bool)(bVar80 >> 2 & 1);
        auVar144._8_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar259;
        bVar82 = (bool)(bVar80 >> 3 & 1);
        auVar144._12_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar260;
        bVar82 = (bool)(bVar80 >> 4 & 1);
        auVar144._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar235;
        bVar82 = (bool)(bVar80 >> 5 & 1);
        auVar144._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar217;
        bVar82 = (bool)(bVar80 >> 6 & 1);
        auVar144._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar236;
        auVar144._28_4_ =
             (uint)(bVar80 >> 7) * 0x7f800000 | (uint)!(bool)(bVar80 >> 7) * auVar120._28_4_;
        local_340 = vminps_avx(auVar129,auVar144);
        auVar262 = ZEXT3264(local_340);
        uVar16 = vcmpps_avx512vl(local_5c0,local_340,2);
        bVar72 = bVar72 & 0x7f & (byte)uVar16;
        if (bVar72 == 0) goto LAB_019d9b06;
        auVar99 = vmaxps_avx512vl(auVar130,auVar98);
        auVar98 = vfmadd213ps_avx512vl(local_620,auVar135,auVar127);
        fVar157 = auVar123._0_4_;
        fVar258 = auVar123._4_4_;
        auVar45._4_4_ = fVar258 * auVar98._4_4_;
        auVar45._0_4_ = fVar157 * auVar98._0_4_;
        fVar259 = auVar123._8_4_;
        auVar45._8_4_ = fVar259 * auVar98._8_4_;
        fVar260 = auVar123._12_4_;
        auVar45._12_4_ = fVar260 * auVar98._12_4_;
        fVar235 = auVar123._16_4_;
        auVar45._16_4_ = fVar235 * auVar98._16_4_;
        fVar217 = auVar123._20_4_;
        auVar45._20_4_ = fVar217 * auVar98._20_4_;
        fVar236 = auVar123._24_4_;
        auVar45._24_4_ = fVar236 * auVar98._24_4_;
        auVar45._28_4_ = auVar98._28_4_;
        auVar98 = vfmadd213ps_avx512vl(local_660,auVar135,auVar127);
        auVar46._4_4_ = fVar258 * auVar98._4_4_;
        auVar46._0_4_ = fVar157 * auVar98._0_4_;
        auVar46._8_4_ = fVar259 * auVar98._8_4_;
        auVar46._12_4_ = fVar260 * auVar98._12_4_;
        auVar46._16_4_ = fVar235 * auVar98._16_4_;
        auVar46._20_4_ = fVar217 * auVar98._20_4_;
        auVar46._24_4_ = fVar236 * auVar98._24_4_;
        auVar46._28_4_ = auVar98._28_4_;
        auVar98 = vminps_avx512vl(auVar45,auVar115);
        auVar52 = ZEXT812(0);
        auVar119 = ZEXT1232(auVar52) << 0x20;
        auVar98 = vmaxps_avx(auVar98,ZEXT1232(auVar52) << 0x20);
        auVar120 = vminps_avx512vl(auVar46,auVar115);
        auVar47._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar98._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar47,auVar165,local_860);
        auVar98 = vmaxps_avx(auVar120,ZEXT1232(auVar52) << 0x20);
        auVar48._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar98._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar48,auVar165,local_860);
        auVar49._4_4_ = auVar99._4_4_ * auVar99._4_4_;
        auVar49._0_4_ = auVar99._0_4_ * auVar99._0_4_;
        auVar49._8_4_ = auVar99._8_4_ * auVar99._8_4_;
        auVar49._12_4_ = auVar99._12_4_ * auVar99._12_4_;
        auVar49._16_4_ = auVar99._16_4_ * auVar99._16_4_;
        auVar49._20_4_ = auVar99._20_4_ * auVar99._20_4_;
        auVar49._24_4_ = auVar99._24_4_ * auVar99._24_4_;
        auVar49._28_4_ = auVar99._28_4_;
        auVar98 = vsubps_avx(local_800,auVar49);
        auVar271 = ZEXT3264(auVar98);
        auVar50._4_4_ = auVar98._4_4_ * (float)local_880._4_4_;
        auVar50._0_4_ = auVar98._0_4_ * (float)local_880._0_4_;
        auVar50._8_4_ = auVar98._8_4_ * fStack_878;
        auVar50._12_4_ = auVar98._12_4_ * fStack_874;
        auVar50._16_4_ = auVar98._16_4_ * fStack_870;
        auVar50._20_4_ = auVar98._20_4_ * fStack_86c;
        auVar50._24_4_ = auVar98._24_4_ * fStack_868;
        auVar50._28_4_ = auVar99._28_4_;
        auVar99 = vsubps_avx(local_740,auVar50);
        uVar16 = vcmpps_avx512vl(auVar99,ZEXT1232(auVar52) << 0x20,5);
        bVar80 = (byte)uVar16;
        if (bVar80 == 0) {
          bVar80 = 0;
          auVar112 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar264 = ZEXT864(0) << 0x20;
          auVar145._8_4_ = 0x7f800000;
          auVar145._0_8_ = 0x7f8000007f800000;
          auVar145._12_4_ = 0x7f800000;
          auVar145._16_4_ = 0x7f800000;
          auVar145._20_4_ = 0x7f800000;
          auVar145._24_4_ = 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar146._8_4_ = 0xff800000;
          auVar146._0_8_ = 0xff800000ff800000;
          auVar146._12_4_ = 0xff800000;
          auVar146._16_4_ = 0xff800000;
          auVar146._20_4_ = 0xff800000;
          auVar146._24_4_ = 0xff800000;
          auVar146._28_4_ = 0xff800000;
        }
        else {
          uVar83 = vcmpps_avx512vl(auVar99,auVar130,5);
          auVar99 = vsqrtps_avx(auVar99);
          auVar115 = vfnmadd213ps_avx512vl(auVar134,local_8a0,auVar115);
          auVar119 = vfmadd132ps_avx512vl(auVar115,local_8a0,local_8a0);
          auVar115 = vsubps_avx(_local_640,auVar99);
          auVar121 = vmulps_avx512vl(auVar115,auVar119);
          auVar99 = vsubps_avx512vl(auVar99,auVar136);
          auVar122 = vmulps_avx512vl(auVar99,auVar119);
          auVar99 = vfmadd213ps_avx512vl(auVar135,auVar121,auVar127);
          auVar51._4_4_ = fVar258 * auVar99._4_4_;
          auVar51._0_4_ = fVar157 * auVar99._0_4_;
          auVar51._8_4_ = fVar259 * auVar99._8_4_;
          auVar51._12_4_ = fVar260 * auVar99._12_4_;
          auVar51._16_4_ = fVar235 * auVar99._16_4_;
          auVar51._20_4_ = fVar217 * auVar99._20_4_;
          auVar51._24_4_ = fVar236 * auVar99._24_4_;
          auVar51._28_4_ = auVar120._28_4_;
          auVar99 = vmulps_avx512vl(local_5e0,auVar121);
          auVar115 = vmulps_avx512vl(local_4a0,auVar121);
          auVar119 = vmulps_avx512vl(local_600,auVar121);
          auVar120 = vfmadd213ps_avx512vl(auVar112,auVar51,auVar116);
          auVar99 = vsubps_avx512vl(auVar99,auVar120);
          auVar120 = vfmadd213ps_avx512vl(auVar113,auVar51,auVar117);
          auVar115 = vsubps_avx512vl(auVar115,auVar120);
          auVar87 = vfmadd213ps_fma(auVar51,auVar114,auVar118);
          auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar87));
          auVar264 = ZEXT3264(auVar119);
          auVar119 = vfmadd213ps_avx512vl(auVar135,auVar122,auVar127);
          auVar120 = vmulps_avx512vl(auVar123,auVar119);
          auVar119 = vmulps_avx512vl(local_5e0,auVar122);
          auVar123 = vmulps_avx512vl(local_4a0,auVar122);
          auVar124 = vmulps_avx512vl(local_600,auVar122);
          auVar87 = vfmadd213ps_fma(auVar112,auVar120,auVar116);
          auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar113,auVar120,auVar117);
          auVar112 = vsubps_avx512vl(auVar123,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar114,auVar120,auVar118);
          auVar113 = vsubps_avx512vl(auVar124,ZEXT1632(auVar87));
          auVar166._8_4_ = 0x7f800000;
          auVar166._0_8_ = 0x7f8000007f800000;
          auVar166._12_4_ = 0x7f800000;
          auVar166._16_4_ = 0x7f800000;
          auVar166._20_4_ = 0x7f800000;
          auVar166._24_4_ = 0x7f800000;
          auVar166._28_4_ = 0x7f800000;
          auVar114 = vblendmps_avx512vl(auVar166,auVar121);
          bVar82 = (bool)((byte)uVar83 & 1);
          auVar145._0_4_ = (uint)bVar82 * auVar114._0_4_ | (uint)!bVar82 * auVar116._0_4_;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar82 * auVar114._4_4_ | (uint)!bVar82 * auVar116._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar82 * auVar114._8_4_ | (uint)!bVar82 * auVar116._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar82 * auVar114._12_4_ | (uint)!bVar82 * auVar116._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar145._16_4_ = (uint)bVar82 * auVar114._16_4_ | (uint)!bVar82 * auVar116._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar145._20_4_ = (uint)bVar82 * auVar114._20_4_ | (uint)!bVar82 * auVar116._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar145._24_4_ = (uint)bVar82 * auVar114._24_4_ | (uint)!bVar82 * auVar116._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar145._28_4_ = (uint)bVar82 * auVar114._28_4_ | (uint)!bVar82 * auVar116._28_4_;
          auVar167._8_4_ = 0xff800000;
          auVar167._0_8_ = 0xff800000ff800000;
          auVar167._12_4_ = 0xff800000;
          auVar167._16_4_ = 0xff800000;
          auVar167._20_4_ = 0xff800000;
          auVar167._24_4_ = 0xff800000;
          auVar167._28_4_ = 0xff800000;
          auVar114 = vblendmps_avx512vl(auVar167,auVar122);
          bVar82 = (bool)((byte)uVar83 & 1);
          auVar146._0_4_ = (uint)bVar82 * auVar114._0_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar146._4_4_ = (uint)bVar82 * auVar114._4_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar146._8_4_ = (uint)bVar82 * auVar114._8_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar146._12_4_ = (uint)bVar82 * auVar114._12_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar146._16_4_ = (uint)bVar82 * auVar114._16_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar146._20_4_ = (uint)bVar82 * auVar114._20_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar146._24_4_ = (uint)bVar82 * auVar114._24_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar146._28_4_ = (uint)bVar82 * auVar114._28_4_ | (uint)!bVar82 * -0x800000;
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar114 = vmulps_avx512vl(local_680,auVar29);
          uVar77 = vcmpps_avx512vl(auVar114,local_6a0,0xe);
          uVar83 = uVar83 & uVar77;
          bVar78 = (byte)uVar83;
          if (bVar78 != 0) {
            uVar77 = vcmpps_avx512vl(auVar98,_DAT_01f7b000,2);
            auVar256._8_4_ = 0x7f800000;
            auVar256._0_8_ = 0x7f8000007f800000;
            auVar256._12_4_ = 0x7f800000;
            auVar256._16_4_ = 0x7f800000;
            auVar256._20_4_ = 0x7f800000;
            auVar256._24_4_ = 0x7f800000;
            auVar256._28_4_ = 0x7f800000;
            auVar270._8_4_ = 0xff800000;
            auVar270._0_8_ = 0xff800000ff800000;
            auVar270._12_4_ = 0xff800000;
            auVar270._16_4_ = 0xff800000;
            auVar270._20_4_ = 0xff800000;
            auVar270._24_4_ = 0xff800000;
            auVar270._28_4_ = 0xff800000;
            auVar271 = ZEXT3264(auVar270);
            auVar98 = vblendmps_avx512vl(auVar256,auVar270);
            bVar73 = (byte)uVar77;
            uVar84 = (uint)(bVar73 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar114._0_4_
            ;
            bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
            uVar150 = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * auVar114._4_4_;
            bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
            uVar151 = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * auVar114._8_4_;
            bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
            uVar152 = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * auVar114._12_4_;
            bVar82 = (bool)((byte)(uVar77 >> 4) & 1);
            uVar153 = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * auVar114._16_4_;
            bVar82 = (bool)((byte)(uVar77 >> 5) & 1);
            uVar154 = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * auVar114._20_4_;
            bVar82 = (bool)((byte)(uVar77 >> 6) & 1);
            uVar155 = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * auVar114._24_4_;
            bVar82 = SUB81(uVar77 >> 7,0);
            uVar156 = (uint)bVar82 * auVar98._28_4_ | (uint)!bVar82 * auVar114._28_4_;
            auVar145._0_4_ = (bVar78 & 1) * uVar84 | !(bool)(bVar78 & 1) * auVar145._0_4_;
            bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar145._4_4_ = bVar82 * uVar150 | !bVar82 * auVar145._4_4_;
            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar145._8_4_ = bVar82 * uVar151 | !bVar82 * auVar145._8_4_;
            bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar145._12_4_ = bVar82 * uVar152 | !bVar82 * auVar145._12_4_;
            bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar145._16_4_ = bVar82 * uVar153 | !bVar82 * auVar145._16_4_;
            bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar145._20_4_ = bVar82 * uVar154 | !bVar82 * auVar145._20_4_;
            bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar145._24_4_ = bVar82 * uVar155 | !bVar82 * auVar145._24_4_;
            bVar82 = SUB81(uVar83 >> 7,0);
            auVar145._28_4_ = bVar82 * uVar156 | !bVar82 * auVar145._28_4_;
            auVar98 = vblendmps_avx512vl(auVar270,auVar256);
            bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
            bVar11 = SUB81(uVar77 >> 7,0);
            auVar146._0_4_ =
                 (uint)(bVar78 & 1) *
                 ((uint)(bVar73 & 1) * auVar98._0_4_ | !(bool)(bVar73 & 1) * uVar84) |
                 !(bool)(bVar78 & 1) * auVar146._0_4_;
            bVar5 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar146._4_4_ =
                 (uint)bVar5 * ((uint)bVar82 * auVar98._4_4_ | !bVar82 * uVar150) |
                 !bVar5 * auVar146._4_4_;
            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar146._8_4_ =
                 (uint)bVar82 * ((uint)bVar6 * auVar98._8_4_ | !bVar6 * uVar151) |
                 !bVar82 * auVar146._8_4_;
            bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar146._12_4_ =
                 (uint)bVar82 * ((uint)bVar7 * auVar98._12_4_ | !bVar7 * uVar152) |
                 !bVar82 * auVar146._12_4_;
            bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar146._16_4_ =
                 (uint)bVar82 * ((uint)bVar8 * auVar98._16_4_ | !bVar8 * uVar153) |
                 !bVar82 * auVar146._16_4_;
            bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar146._20_4_ =
                 (uint)bVar82 * ((uint)bVar9 * auVar98._20_4_ | !bVar9 * uVar154) |
                 !bVar82 * auVar146._20_4_;
            bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar146._24_4_ =
                 (uint)bVar82 * ((uint)bVar10 * auVar98._24_4_ | !bVar10 * uVar155) |
                 !bVar82 * auVar146._24_4_;
            bVar82 = SUB81(uVar83 >> 7,0);
            auVar146._28_4_ =
                 (uint)bVar82 * ((uint)bVar11 * auVar98._28_4_ | !bVar11 * uVar156) |
                 !bVar82 * auVar146._28_4_;
            bVar80 = (~bVar78 | bVar73) & bVar80;
          }
        }
        auVar98 = vmulps_avx512vl(local_600,auVar113);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_4a0,auVar112);
        auVar257 = ZEXT3264(local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_5e0,auVar119);
        auVar266 = ZEXT3264(local_5c0);
        _local_200 = local_5c0;
        local_1e0 = vminps_avx(local_340,auVar145);
        auVar251._8_4_ = 0x7fffffff;
        auVar251._0_8_ = 0x7fffffff7fffffff;
        auVar251._12_4_ = 0x7fffffff;
        auVar251._16_4_ = 0x7fffffff;
        auVar251._20_4_ = 0x7fffffff;
        auVar251._24_4_ = 0x7fffffff;
        auVar251._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar98,auVar251);
        _local_580 = vmaxps_avx(local_5c0,auVar146);
        _local_360 = _local_580;
        auVar252._8_4_ = 0x3e99999a;
        auVar252._0_8_ = 0x3e99999a3e99999a;
        auVar252._12_4_ = 0x3e99999a;
        auVar252._16_4_ = 0x3e99999a;
        auVar252._20_4_ = 0x3e99999a;
        auVar252._24_4_ = 0x3e99999a;
        auVar252._28_4_ = 0x3e99999a;
        auVar253 = ZEXT3264(auVar252);
        uVar16 = vcmpps_avx512vl(auVar98,auVar252,1);
        uVar18 = vcmpps_avx512vl(local_5c0,local_1e0,2);
        bVar78 = (byte)uVar18 & bVar72;
        uVar17 = vcmpps_avx512vl(_local_580,local_340,2);
        if ((bVar72 & ((byte)uVar17 | (byte)uVar18)) == 0) {
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar274 = ZEXT3264(auVar98);
          auVar247 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          bVar73 = (byte)uVar16 | ~bVar80;
          auVar98 = vmulps_avx512vl(local_600,auVar264._0_32_);
          auVar87 = vfmadd213ps_fma(auVar115,local_4a0,auVar98);
          auVar98 = vfmadd213ps_avx512vl(auVar99,local_5e0,ZEXT1632(auVar87));
          auVar98 = vandps_avx(auVar98,auVar251);
          uVar16 = vcmpps_avx512vl(auVar98,auVar252,1);
          bVar80 = (byte)uVar16 | ~bVar80;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar168,auVar30);
          local_320._0_4_ = (uint)(bVar80 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
          bVar82 = (bool)(bVar80 >> 1 & 1);
          local_320._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar80 >> 2 & 1);
          local_320._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar80 >> 3 & 1);
          local_320._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar80 >> 4 & 1);
          local_320._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar80 >> 5 & 1);
          local_320._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar80 >> 6 & 1);
          local_320._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 2;
          local_320._28_4_ = (uint)(bVar80 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
          local_500 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_500,local_320,5);
          local_560 = local_5c0._0_4_ + (float)local_5a0._0_4_;
          fStack_55c = local_5c0._4_4_ + (float)local_5a0._4_4_;
          fStack_558 = local_5c0._8_4_ + fStack_598;
          fStack_554 = local_5c0._12_4_ + fStack_594;
          fStack_550 = local_5c0._16_4_ + fStack_590;
          fStack_54c = local_5c0._20_4_ + fStack_58c;
          fStack_548 = local_5c0._24_4_ + fStack_588;
          fStack_544 = local_5c0._28_4_ + fStack_584;
          for (bVar80 = (byte)uVar16 & bVar78; bVar80 != 0;
              bVar80 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar80 & (byte)uVar16) {
            auVar169._8_4_ = 0x7f800000;
            auVar169._0_8_ = 0x7f8000007f800000;
            auVar169._12_4_ = 0x7f800000;
            auVar169._16_4_ = 0x7f800000;
            auVar169._20_4_ = 0x7f800000;
            auVar169._24_4_ = 0x7f800000;
            auVar169._28_4_ = 0x7f800000;
            auVar98 = vblendmps_avx512vl(auVar169,local_5c0);
            auVar147._0_4_ =
                 (uint)(bVar80 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 1 & 1);
            auVar147._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 2 & 1);
            auVar147._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 3 & 1);
            auVar147._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 4 & 1);
            auVar147._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 5 & 1);
            auVar147._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
            auVar147._24_4_ =
                 (uint)(bVar80 >> 6) * auVar98._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar98 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar98 = vminps_avx(auVar147,auVar98);
            auVar99 = vshufpd_avx(auVar98,auVar98,5);
            auVar98 = vminps_avx(auVar98,auVar99);
            auVar99 = vpermpd_avx2(auVar98,0x4e);
            auVar98 = vminps_avx(auVar98,auVar99);
            uVar16 = vcmpps_avx512vl(auVar147,auVar98,0);
            bVar74 = (byte)uVar16 & bVar80;
            bVar75 = bVar80;
            if (bVar74 != 0) {
              bVar75 = bVar74;
            }
            iVar19 = 0;
            for (uVar84 = (uint)bVar75; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar84 = *(uint *)(local_200 + (uint)(iVar19 << 2));
            fVar157 = auVar13._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
            if ((float)local_7e0._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar264 = ZEXT1664(auVar264._0_16_);
              auVar266 = ZEXT1664(auVar266._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar157 = sqrtf((float)local_7e0._0_4_);
              auVar87 = local_860._0_16_;
            }
            auVar253 = ZEXT464(uVar84);
            auVar85 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar92 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar97 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar93 = vminps_avx(auVar85,auVar97);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar97 = vmaxps_avx(auVar92,auVar85);
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx(auVar93,auVar218);
            auVar85 = vandps_avx(auVar97,auVar218);
            auVar92 = vmaxps_avx(auVar92,auVar85);
            auVar85 = vmovshdup_avx(auVar92);
            auVar85 = vmaxss_avx(auVar85,auVar92);
            auVar92 = vshufpd_avx(auVar92,auVar92,1);
            auVar92 = vmaxss_avx(auVar92,auVar85);
            fVar258 = auVar92._0_4_ * 1.9073486e-06;
            local_840._0_4_ = fVar157 * 1.9073486e-06;
            local_6f0 = vshufps_avx(auVar97,auVar97,0xff);
            auVar87 = vinsertps_avx(ZEXT416(uVar84),auVar87,0x10);
            auVar262 = ZEXT1664(auVar87);
            lVar81 = 5;
            do {
              do {
                bVar82 = lVar81 == 0;
                lVar81 = lVar81 + -1;
                if (bVar82) goto LAB_019da6a4;
                uVar182 = auVar262._0_4_;
                auVar159._4_4_ = uVar182;
                auVar159._0_4_ = uVar182;
                auVar159._8_4_ = uVar182;
                auVar159._12_4_ = uVar182;
                auVar87 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_7d0);
                local_740 = auVar262._0_32_;
                auVar92 = vmovshdup_avx(auVar262._0_16_);
                fVar235 = auVar92._0_4_;
                fVar272 = 1.0 - fVar235;
                fVar260 = fVar272 * fVar272 * fVar272;
                fVar157 = fVar235 * fVar235;
                fVar236 = fVar235 * fVar157;
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar260),
                                          ZEXT416((uint)fVar236));
                fVar259 = fVar235 * fVar272;
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar259 * 6.0)),
                                          ZEXT416((uint)(fVar272 * fVar259)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                          ZEXT416((uint)fVar260));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar272 * fVar259 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar235 * fVar259)));
                fVar260 = fVar260 * 0.16666667;
                fVar235 = (auVar85._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar217 = (auVar97._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar236 = fVar236 * 0.16666667;
                auVar200._0_4_ = fVar236 * (float)local_7c0._0_4_;
                auVar200._4_4_ = fVar236 * (float)local_7c0._4_4_;
                auVar200._8_4_ = fVar236 * fStack_7b8;
                auVar200._12_4_ = fVar236 * fStack_7b4;
                auVar237._4_4_ = fVar217;
                auVar237._0_4_ = fVar217;
                auVar237._8_4_ = fVar217;
                auVar237._12_4_ = fVar217;
                auVar85 = vfmadd132ps_fma(auVar237,auVar200,local_780._0_16_);
                auVar201._4_4_ = fVar235;
                auVar201._0_4_ = fVar235;
                auVar201._8_4_ = fVar235;
                auVar201._12_4_ = fVar235;
                auVar85 = vfmadd132ps_fma(auVar201,auVar85,local_7a0._0_16_);
                auVar183._4_4_ = fVar260;
                auVar183._0_4_ = fVar260;
                auVar183._8_4_ = fVar260;
                auVar183._12_4_ = fVar260;
                auVar85 = vfmadd132ps_fma(auVar183,auVar85,local_760._0_16_);
                local_620._0_16_ = auVar85;
                auVar85 = vsubps_avx(auVar87,auVar85);
                auVar87 = vdpps_avx(auVar85,auVar85,0x7f);
                local_800._0_16_ = auVar87;
                local_860._0_16_ = ZEXT416((uint)fVar272);
                if (auVar87._0_4_ < 0.0) {
                  local_880._0_4_ = fVar157;
                  local_8a0._0_4_ = fVar259;
                  auVar253._0_4_ = sqrtf(auVar87._0_4_);
                  auVar253._4_60_ = extraout_var;
                  auVar87 = auVar253._0_16_;
                  fVar259 = (float)local_8a0._0_4_;
                  auVar97 = local_860._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  local_880._0_4_ = fVar157;
                  auVar97 = ZEXT416((uint)fVar272);
                }
                local_640._4_4_ = auVar97._0_4_;
                local_640._0_4_ = local_640._4_4_;
                fStack_638 = (float)local_640._4_4_;
                fStack_634 = (float)local_640._4_4_;
                auVar93 = vfnmsub213ss_fma(auVar92,auVar92,ZEXT416((uint)(fVar259 * 4.0)));
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * 4.0)),auVar97,auVar97);
                fVar157 = (float)local_640._4_4_ * -(float)local_640._4_4_ * 0.5;
                fVar259 = auVar93._0_4_ * 0.5;
                fVar260 = auVar97._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar219._0_4_ = (float)local_880._0_4_ * (float)local_7c0._0_4_;
                auVar219._4_4_ = (float)local_880._0_4_ * (float)local_7c0._4_4_;
                auVar219._8_4_ = (float)local_880._0_4_ * fStack_7b8;
                auVar219._12_4_ = (float)local_880._0_4_ * fStack_7b4;
                auVar184._4_4_ = fVar260;
                auVar184._0_4_ = fVar260;
                auVar184._8_4_ = fVar260;
                auVar184._12_4_ = fVar260;
                auVar97 = vfmadd132ps_fma(auVar184,auVar219,local_780._0_16_);
                auVar202._4_4_ = fVar259;
                auVar202._0_4_ = fVar259;
                auVar202._8_4_ = fVar259;
                auVar202._12_4_ = fVar259;
                auVar97 = vfmadd132ps_fma(auVar202,auVar97,local_7a0._0_16_);
                auVar267._4_4_ = fVar157;
                auVar267._0_4_ = fVar157;
                auVar267._8_4_ = fVar157;
                auVar267._12_4_ = fVar157;
                _local_880 = vfmadd132ps_fma(auVar267,auVar97,local_760._0_16_);
                local_660._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar157 = local_660._0_4_;
                local_830 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar157));
                fVar259 = local_830._0_4_;
                local_680._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar157));
                auVar97 = vfnmadd213ss_fma(local_680._0_16_,local_660._0_16_,ZEXT416(0x40000000));
                local_6a0._0_4_ = auVar97._0_4_;
                local_8a0._0_4_ = auVar87._0_4_;
                if (fVar157 < -fVar157) {
                  fVar260 = sqrtf(fVar157);
                  auVar87 = ZEXT416((uint)local_8a0._0_4_);
                  auVar97 = _local_880;
                }
                else {
                  auVar97 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                  fVar260 = auVar97._0_4_;
                  auVar97 = _local_880;
                }
                fVar235 = local_830._0_4_;
                fVar157 = fVar259 * 1.5 + fVar157 * -0.5 * fVar235 * fVar235 * fVar235;
                local_830._0_4_ = auVar97._0_4_ * fVar157;
                local_830._4_4_ = auVar97._4_4_ * fVar157;
                local_830._8_4_ = auVar97._8_4_ * fVar157;
                local_830._12_4_ = auVar97._12_4_ * fVar157;
                auVar93 = vdpps_avx(auVar85,local_830,0x7f);
                fVar217 = auVar87._0_4_;
                fVar259 = auVar93._0_4_;
                auVar160._0_4_ = fVar259 * fVar259;
                auVar160._4_4_ = auVar93._4_4_ * auVar93._4_4_;
                auVar160._8_4_ = auVar93._8_4_ * auVar93._8_4_;
                auVar160._12_4_ = auVar93._12_4_ * auVar93._12_4_;
                auVar86 = vsubps_avx(local_800._0_16_,auVar160);
                fVar235 = auVar86._0_4_;
                auVar185._4_12_ = ZEXT812(0) << 0x20;
                auVar185._0_4_ = fVar235;
                auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
                auVar89 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
                auVar90 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar235 < 0.0) {
                  local_6b0._0_4_ = fVar260;
                  local_6d0._0_4_ = auVar89._0_4_;
                  local_6e0._4_4_ = fVar157;
                  local_6e0._0_4_ = fVar157;
                  fStack_6d8 = fVar157;
                  fStack_6d4 = fVar157;
                  local_6c0 = auVar88;
                  fVar235 = sqrtf(fVar235);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar89 = ZEXT416((uint)local_6d0._0_4_);
                  auVar87 = ZEXT416((uint)local_8a0._0_4_);
                  auVar88 = local_6c0;
                  auVar97 = _local_880;
                  fVar157 = (float)local_6e0._0_4_;
                  fVar236 = (float)local_6e0._4_4_;
                  fVar272 = fStack_6d8;
                  fVar273 = fStack_6d4;
                  fVar260 = (float)local_6b0._0_4_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar235 = auVar86._0_4_;
                  fVar236 = fVar157;
                  fVar272 = fVar157;
                  fVar273 = fVar157;
                }
                auVar271 = ZEXT1664(auVar97);
                auVar266 = ZEXT1664(local_800._0_16_);
                auVar264 = ZEXT1664(auVar85);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar92);
                auVar94 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar96 = local_740._0_16_;
                auVar92 = vshufps_avx(auVar96,auVar96,0x55);
                auVar203._0_4_ = auVar92._0_4_ * (float)local_7c0._0_4_;
                auVar203._4_4_ = auVar92._4_4_ * (float)local_7c0._4_4_;
                auVar203._8_4_ = auVar92._8_4_ * fStack_7b8;
                auVar203._12_4_ = auVar92._12_4_ * fStack_7b4;
                auVar220._0_4_ = auVar94._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar92 = vfmadd132ps_fma(auVar220,auVar203,local_780._0_16_);
                auVar186._0_4_ = auVar86._0_4_;
                auVar186._4_4_ = auVar186._0_4_;
                auVar186._8_4_ = auVar186._0_4_;
                auVar186._12_4_ = auVar186._0_4_;
                auVar92 = vfmadd132ps_fma(auVar186,auVar92,local_7a0._0_16_);
                auVar92 = vfmadd132ps_fma(_local_640,auVar92,local_760._0_16_);
                auVar187._0_4_ = auVar92._0_4_ * (float)local_660._0_4_;
                auVar187._4_4_ = auVar92._4_4_ * (float)local_660._0_4_;
                auVar187._8_4_ = auVar92._8_4_ * (float)local_660._0_4_;
                auVar187._12_4_ = auVar92._12_4_ * (float)local_660._0_4_;
                auVar92 = vdpps_avx(auVar97,auVar92,0x7f);
                fVar199 = auVar92._0_4_;
                auVar204._0_4_ = auVar97._0_4_ * fVar199;
                auVar204._4_4_ = auVar97._4_4_ * fVar199;
                auVar204._8_4_ = auVar97._8_4_ * fVar199;
                auVar204._12_4_ = auVar97._12_4_ * fVar199;
                auVar92 = vsubps_avx(auVar187,auVar204);
                fVar199 = (float)local_6a0._0_4_ * (float)local_680._0_4_;
                auVar94 = vmaxss_avx(ZEXT416((uint)fVar258),
                                     ZEXT416((uint)(local_740._0_4_ * (float)local_840._0_4_)));
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(auVar97,auVar21);
                auVar205._0_4_ = fVar157 * auVar92._0_4_ * fVar199;
                auVar205._4_4_ = fVar236 * auVar92._4_4_ * fVar199;
                auVar205._8_4_ = fVar272 * auVar92._8_4_ * fVar199;
                auVar205._12_4_ = fVar273 * auVar92._12_4_ * fVar199;
                auVar92 = vdpps_avx(auVar91,local_830,0x7f);
                auVar86 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar258),auVar94);
                auVar87 = vdpps_avx(auVar85,auVar205,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)(fVar217 + 1.0)),
                                          ZEXT416((uint)(fVar258 / fVar260)),auVar86);
                fVar157 = auVar92._0_4_ + auVar87._0_4_;
                auVar87 = vdpps_avx(local_7d0,local_830,0x7f);
                auVar92 = vdpps_avx(auVar85,auVar91,0x7f);
                auVar86 = vmulss_avx512f(auVar90,auVar88);
                auVar90 = vaddss_avx512f(auVar89,ZEXT416((uint)(auVar86._0_4_ *
                                                               auVar88._0_4_ * auVar88._0_4_)));
                auVar86 = vdpps_avx(auVar85,local_7d0,0x7f);
                auVar89 = vfnmadd231ss_fma(auVar92,auVar93,ZEXT416((uint)fVar157));
                auVar86 = vfnmadd231ss_fma(auVar86,auVar93,auVar87);
                auVar92 = vpermilps_avx(local_620._0_16_,0xff);
                fVar235 = fVar235 - auVar92._0_4_;
                auVar88 = vshufps_avx(auVar97,auVar97,0xff);
                auVar92 = vfmsub213ss_fma(auVar89,auVar90,auVar88);
                auVar254._8_4_ = 0x80000000;
                auVar254._0_8_ = 0x8000000080000000;
                auVar254._12_4_ = 0x80000000;
                auVar257 = ZEXT1664(auVar254);
                auVar249._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
                auVar249._8_4_ = auVar92._8_4_ ^ 0x80000000;
                auVar249._12_4_ = auVar92._12_4_ ^ 0x80000000;
                auVar253 = ZEXT1664(auVar249);
                auVar86 = ZEXT416((uint)(auVar86._0_4_ * auVar90._0_4_));
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar157),auVar86);
                auVar92 = vinsertps_avx(auVar249,auVar86,0x1c);
                auVar243._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                auVar243._8_4_ = auVar87._8_4_ ^ 0x80000000;
                auVar243._12_4_ = auVar87._12_4_ ^ 0x80000000;
                auVar86 = vinsertps_avx(ZEXT416((uint)fVar157),auVar243,0x10);
                auVar221._0_4_ = auVar89._0_4_;
                auVar221._4_4_ = auVar221._0_4_;
                auVar221._8_4_ = auVar221._0_4_;
                auVar221._12_4_ = auVar221._0_4_;
                auVar87 = vdivps_avx(auVar92,auVar221);
                auVar92 = vdivps_avx(auVar86,auVar221);
                auVar222._0_4_ = fVar259 * auVar87._0_4_ + fVar235 * auVar92._0_4_;
                auVar222._4_4_ = fVar259 * auVar87._4_4_ + fVar235 * auVar92._4_4_;
                auVar222._8_4_ = fVar259 * auVar87._8_4_ + fVar235 * auVar92._8_4_;
                auVar222._12_4_ = fVar259 * auVar87._12_4_ + fVar235 * auVar92._12_4_;
                auVar87 = vsubps_avx(auVar96,auVar222);
                auVar262 = ZEXT1664(auVar87);
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx512vl(auVar93,auVar22);
              } while (auVar95._0_4_ <= auVar92._0_4_);
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ + auVar94._0_4_)),local_6f0,
                                        ZEXT416(0x36000000));
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar93 = vandps_avx512vl(ZEXT416((uint)fVar235),auVar23);
            } while (auVar92._0_4_ <= auVar93._0_4_);
            fVar157 = auVar87._0_4_ + (float)local_700._0_4_;
            if ((fVar174 <= fVar157) &&
               (fVar258 = pre->ray_space[4].vz.field_0.m128[(long)ray], fVar157 <= fVar258)) {
              auVar92 = vmovshdup_avx(auVar87);
              fVar259 = auVar92._0_4_;
              if ((0.0 <= fVar259) && (fVar259 <= 1.0)) {
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_800._0_4_));
                fVar260 = auVar92._0_4_;
                lVar81 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar176 * 8);
                if ((*(uint *)(lVar81 + 0x34) & (uint)pre->ray_space[5].vy.field_0.m128[(long)ray])
                    != 0) {
                  fVar260 = fVar260 * 1.5 + local_800._0_4_ * -0.5 * fVar260 * fVar260 * fVar260;
                  auVar223._0_4_ = auVar85._0_4_ * fVar260;
                  auVar223._4_4_ = auVar85._4_4_ * fVar260;
                  auVar223._8_4_ = auVar85._8_4_ * fVar260;
                  auVar223._12_4_ = auVar85._12_4_ * fVar260;
                  auVar88 = vfmadd213ps_fma(auVar88,auVar223,auVar97);
                  auVar92 = vshufps_avx(auVar223,auVar223,0xc9);
                  auVar93 = vshufps_avx(auVar97,auVar97,0xc9);
                  auVar224._0_4_ = auVar223._0_4_ * auVar93._0_4_;
                  auVar224._4_4_ = auVar223._4_4_ * auVar93._4_4_;
                  auVar224._8_4_ = auVar223._8_4_ * auVar93._8_4_;
                  auVar224._12_4_ = auVar223._12_4_ * auVar93._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar224,auVar97,auVar92);
                  auVar92 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar93 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar161._0_4_ = auVar88._0_4_ * auVar86._0_4_;
                  auVar161._4_4_ = auVar88._4_4_ * auVar86._4_4_;
                  auVar161._8_4_ = auVar88._8_4_ * auVar86._8_4_;
                  auVar161._12_4_ = auVar88._12_4_ * auVar86._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar161,auVar92,auVar93);
                  fVar260 = auVar92._0_4_;
                  if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) &&
                     (*(long *)(lVar81 + 0x40) == 0)) {
                    pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar157;
                    fVar157 = (float)vextractps_avx(auVar92,1);
                    pre->ray_space[7].vy.field_0.m128[(long)ray] = fVar157;
                    uVar182 = vextractps_avx(auVar92,2);
                    *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x20) = uVar182;
                    pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar260;
                    pre[1].ray_space[0].vz.field_0.m128[(long)ray] = fVar259;
                    pre[1].ray_space[1].vy.field_0.m128[(long)ray] = 0.0;
                    pre[1].ray_space[2].vx.field_0.m128[(long)ray] = fVar2;
                    pre[1].ray_space[2].vz.field_0.m128[(long)ray] = fVar176;
                    pre[1].ray_space[3].vy.field_0.m128[(long)ray] = **(float **)(k + 8);
                    pre[1].ray_space[4].vx.field_0.m128[(long)ray] =
                         *(float *)(*(long *)(k + 8) + 4);
                  }
                  else {
                    puVar3 = *(undefined4 **)(k + 8);
                    auVar232._8_4_ = 1;
                    auVar232._0_8_ = 0x100000001;
                    auVar232._12_4_ = 1;
                    auVar232._16_4_ = 1;
                    auVar232._20_4_ = 1;
                    auVar232._24_4_ = 1;
                    auVar232._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar232,ZEXT1632(auVar87));
                    local_480 = vpermps_avx2(auVar232,ZEXT1632(auVar92));
                    auVar241._8_4_ = 2;
                    auVar241._0_8_ = 0x200000002;
                    auVar241._12_4_ = 2;
                    auVar241._16_4_ = 2;
                    auVar241._20_4_ = 2;
                    auVar241._24_4_ = 2;
                    auVar241._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar241,ZEXT1632(auVar92));
                    local_440 = fVar260;
                    fStack_43c = fVar260;
                    fStack_438 = fVar260;
                    fStack_434 = fVar260;
                    fStack_430 = fVar260;
                    fStack_42c = fVar260;
                    fStack_428 = fVar260;
                    fStack_424 = fVar260;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4e0._0_8_;
                    uStack_3d8 = local_4e0._8_8_;
                    uStack_3d0 = local_4e0._16_8_;
                    uStack_3c8 = local_4e0._24_8_;
                    local_3c0 = local_4c0;
                    auVar98 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_820[1] = auVar98;
                    *local_820 = auVar98;
                    local_3a0._0_4_ = *puVar3;
                    local_3a0._4_4_ = local_3a0._0_4_;
                    local_3a0._8_4_ = local_3a0._0_4_;
                    local_3a0._12_4_ = local_3a0._0_4_;
                    local_3a0._16_4_ = local_3a0._0_4_;
                    local_3a0._20_4_ = local_3a0._0_4_;
                    local_3a0._24_4_ = local_3a0._0_4_;
                    local_3a0._28_4_ = local_3a0._0_4_;
                    local_380 = puVar3[1];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar157;
                    local_720 = local_520;
                    local_8d0 = local_720;
                    local_8c8 = *(undefined8 *)(lVar81 + 0x18);
                    local_8c0 = *(undefined8 *)(k + 8);
                    local_8b0 = (int *)local_480;
                    local_8a8 = 8;
                    local_8b8 = pre;
                    if (*(code **)(lVar81 + 0x40) != (code *)0x0) {
                      auVar253 = ZEXT1664(auVar249);
                      auVar257 = ZEXT1664(auVar254);
                      auVar262 = ZEXT1664(auVar87);
                      auVar264 = ZEXT1664(auVar85);
                      auVar266 = ZEXT1664(local_800._0_16_);
                      auVar271 = ZEXT1664(auVar97);
                      (**(code **)(lVar81 + 0x40))(&local_8d0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      pcVar4 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                      if ((pcVar4 != (code *)0x0) &&
                         (((**(byte **)(k + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar81 + 0x3e) & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        (*pcVar4)(&local_8d0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar83 = vptestmd_avx512vl(local_720,local_720);
                        iVar55 = local_8b0[1];
                        iVar56 = local_8b0[2];
                        iVar57 = local_8b0[3];
                        iVar58 = local_8b0[4];
                        iVar59 = local_8b0[5];
                        iVar60 = local_8b0[6];
                        iVar61 = local_8b0[7];
                        pVVar1 = &local_8b8->ray_space[7].vy;
                        iVar62 = *(int *)((long)&local_8b8->ray_space[7].vy.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8->ray_space[7].vy.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8->ray_space[7].vy.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8->ray_space[7].vz.field_0;
                        iVar66 = *(int *)((long)&local_8b8->ray_space[7].vz.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8->ray_space[7].vz.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8->ray_space[7].vz.field_0 + 0xc);
                        bVar75 = (byte)uVar83;
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar75 & 1) * *local_8b0 |
                                    (uint)!(bool)(bVar75 & 1) * *(int *)&pVVar1->field_0);
                        local_8b8->ray_space[7].vy.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8->ray_space[7].vy.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8->ray_space[7].vy.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8->ray_space[7].vz.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8->ray_space[7].vz.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8->ray_space[7].vz.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8->ray_space[7].vz.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        iVar55 = local_8b0[9];
                        iVar56 = local_8b0[10];
                        iVar57 = local_8b0[0xb];
                        iVar58 = local_8b0[0xc];
                        iVar59 = local_8b0[0xd];
                        iVar60 = local_8b0[0xe];
                        iVar61 = local_8b0[0xf];
                        iVar62 = local_8b8[1].depth_scale.field_0.i[1];
                        iVar63 = local_8b8[1].depth_scale.field_0.i[2];
                        iVar64 = local_8b8[1].depth_scale.field_0.i[3];
                        iVar65 = local_8b8[1].depth_scale.field_0.i[4];
                        iVar66 = local_8b8[1].depth_scale.field_0.i[5];
                        iVar67 = local_8b8[1].depth_scale.field_0.i[6];
                        iVar68 = local_8b8[1].depth_scale.field_0.i[7];
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        local_8b8[1].depth_scale.field_0.i[0] =
                             (uint)(bVar75 & 1) * local_8b0[8] |
                             (uint)!(bool)(bVar75 & 1) * local_8b8[1].depth_scale.field_0.i[0];
                        local_8b8[1].depth_scale.field_0.i[1] =
                             (uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62;
                        local_8b8[1].depth_scale.field_0.i[2] =
                             (uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63;
                        local_8b8[1].depth_scale.field_0.i[3] =
                             (uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64;
                        local_8b8[1].depth_scale.field_0.i[4] =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65;
                        local_8b8[1].depth_scale.field_0.i[5] =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66;
                        local_8b8[1].depth_scale.field_0.i[6] =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67;
                        local_8b8[1].depth_scale.field_0.i[7] =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68;
                        iVar55 = local_8b0[0x11];
                        iVar56 = local_8b0[0x12];
                        iVar57 = local_8b0[0x13];
                        iVar58 = local_8b0[0x14];
                        iVar59 = local_8b0[0x15];
                        iVar60 = local_8b0[0x16];
                        iVar61 = local_8b0[0x17];
                        iVar62 = *(int *)((long)&local_8b8[1].ray_space[0].vx.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8[1].ray_space[0].vx.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8[1].ray_space[0].vx.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8[1].ray_space[0].vy.field_0;
                        iVar66 = *(int *)((long)&local_8b8[1].ray_space[0].vy.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8[1].ray_space[0].vy.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8[1].ray_space[0].vy.field_0 + 0xc);
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        local_8b8[1].ray_space[0].vx.field_0.m128[0] =
                             (float)((uint)(bVar75 & 1) * local_8b0[0x10] |
                                    (uint)!(bool)(bVar75 & 1) *
                                    *(int *)&local_8b8[1].ray_space[0].vx.field_0);
                        local_8b8[1].ray_space[0].vx.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8[1].ray_space[0].vx.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8[1].ray_space[0].vx.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8[1].ray_space[0].vy.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8[1].ray_space[0].vy.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8[1].ray_space[0].vy.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8[1].ray_space[0].vy.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        iVar55 = local_8b0[0x19];
                        iVar56 = local_8b0[0x1a];
                        iVar57 = local_8b0[0x1b];
                        iVar58 = local_8b0[0x1c];
                        iVar59 = local_8b0[0x1d];
                        iVar60 = local_8b0[0x1e];
                        iVar61 = local_8b0[0x1f];
                        pVVar1 = &local_8b8[1].ray_space[0].vz;
                        iVar62 = *(int *)((long)&local_8b8[1].ray_space[0].vz.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8[1].ray_space[0].vz.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8[1].ray_space[0].vz.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8[1].ray_space[1].vx.field_0;
                        iVar66 = *(int *)((long)&local_8b8[1].ray_space[1].vx.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8[1].ray_space[1].vx.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8[1].ray_space[1].vx.field_0 + 0xc);
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar75 & 1) * local_8b0[0x18] |
                                    (uint)!(bool)(bVar75 & 1) * *(int *)&pVVar1->field_0);
                        local_8b8[1].ray_space[0].vz.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8[1].ray_space[0].vz.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8[1].ray_space[0].vz.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8[1].ray_space[1].vx.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8[1].ray_space[1].vx.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8[1].ray_space[1].vx.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8[1].ray_space[1].vx.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        iVar55 = local_8b0[0x21];
                        iVar56 = local_8b0[0x22];
                        iVar57 = local_8b0[0x23];
                        iVar58 = local_8b0[0x24];
                        iVar59 = local_8b0[0x25];
                        iVar60 = local_8b0[0x26];
                        iVar61 = local_8b0[0x27];
                        pVVar1 = &local_8b8[1].ray_space[1].vy;
                        iVar62 = *(int *)((long)&local_8b8[1].ray_space[1].vy.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8[1].ray_space[1].vy.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8[1].ray_space[1].vy.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8[1].ray_space[1].vz.field_0;
                        iVar66 = *(int *)((long)&local_8b8[1].ray_space[1].vz.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8[1].ray_space[1].vz.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8[1].ray_space[1].vz.field_0 + 0xc);
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar75 & 1) * local_8b0[0x20] |
                                    (uint)!(bool)(bVar75 & 1) * *(int *)&pVVar1->field_0);
                        local_8b8[1].ray_space[1].vy.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8[1].ray_space[1].vy.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8[1].ray_space[1].vy.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8[1].ray_space[1].vz.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8[1].ray_space[1].vz.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8[1].ray_space[1].vz.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8[1].ray_space[1].vz.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x28));
                        local_8b8[1].ray_space[2].vx = (Vector)auVar98._0_16_;
                        local_8b8[1].ray_space[2].vy = (Vector)auVar98._16_16_;
                        auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x30));
                        *(undefined1 (*) [32])&local_8b8[1].ray_space[2].vz = auVar98;
                        auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x38));
                        local_8b8[1].ray_space[3].vy = (Vector)auVar98._0_16_;
                        local_8b8[1].ray_space[3].vz = (Vector)auVar98._16_16_;
                        auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x40));
                        local_8b8[1].ray_space[4].vx = (Vector)auVar98._0_16_;
                        local_8b8[1].ray_space[4].vy = (Vector)auVar98._16_16_;
                        goto LAB_019da6a4;
                      }
                    }
                    pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar258;
                  }
                }
              }
            }
LAB_019da6a4:
            uVar182 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
            auVar245._4_4_ = uVar182;
            auVar245._0_4_ = uVar182;
            auVar245._8_4_ = uVar182;
            auVar245._12_4_ = uVar182;
            auVar245._16_4_ = uVar182;
            auVar245._20_4_ = uVar182;
            auVar245._24_4_ = uVar182;
            auVar245._28_4_ = uVar182;
            auVar247 = ZEXT3264(auVar245);
            auVar69._4_4_ = fStack_55c;
            auVar69._0_4_ = local_560;
            auVar69._8_4_ = fStack_558;
            auVar69._12_4_ = fStack_554;
            auVar69._16_4_ = fStack_550;
            auVar69._20_4_ = fStack_54c;
            auVar69._24_4_ = fStack_548;
            auVar69._28_4_ = fStack_544;
            uVar16 = vcmpps_avx512vl(auVar245,auVar69,0xd);
          }
          auVar170._0_4_ = (float)local_5a0._0_4_ + (float)local_580._0_4_;
          auVar170._4_4_ = (float)local_5a0._4_4_ + (float)local_580._4_4_;
          auVar170._8_4_ = fStack_598 + fStack_578;
          auVar170._12_4_ = fStack_594 + fStack_574;
          auVar170._16_4_ = fStack_590 + fStack_570;
          auVar170._20_4_ = fStack_58c + fStack_56c;
          auVar170._24_4_ = fStack_588 + fStack_568;
          auVar170._28_4_ = fStack_584 + fStack_564;
          uVar182 = auVar247._0_4_;
          auVar194._4_4_ = uVar182;
          auVar194._0_4_ = uVar182;
          auVar194._8_4_ = uVar182;
          auVar194._12_4_ = uVar182;
          auVar194._16_4_ = uVar182;
          auVar194._20_4_ = uVar182;
          auVar194._24_4_ = uVar182;
          auVar194._28_4_ = uVar182;
          uVar16 = vcmpps_avx512vl(auVar170,auVar194,2);
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar171,auVar31);
          local_580._0_4_ = (uint)(bVar73 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar82 = (bool)(bVar73 >> 1 & 1);
          local_580._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar73 >> 2 & 1);
          fStack_578 = (float)((uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 3 & 1);
          fStack_574 = (float)((uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 4 & 1);
          fStack_570 = (float)((uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 5 & 1);
          fStack_56c = (float)((uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 6 & 1);
          fStack_568 = (float)((uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 2);
          fStack_564 = (float)((uint)(bVar73 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2
                              );
          bVar72 = (byte)uVar17 & bVar72 & (byte)uVar16;
          uVar16 = vpcmpd_avx512vl(_local_580,local_500,2);
          local_5c0 = _local_360;
          local_560 = (float)local_5a0._0_4_ + (float)local_360._0_4_;
          fStack_55c = (float)local_5a0._4_4_ + (float)local_360._4_4_;
          fStack_558 = fStack_598 + fStack_358;
          fStack_554 = fStack_594 + fStack_354;
          fStack_550 = fStack_590 + fStack_350;
          fStack_54c = fStack_58c + fStack_34c;
          fStack_548 = fStack_588 + fStack_348;
          fStack_544 = fStack_584 + fStack_344;
          for (bVar80 = (byte)uVar16 & bVar72; bVar80 != 0;
              bVar80 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar80 & (byte)uVar16) {
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar98 = vblendmps_avx512vl(auVar172,local_5c0);
            auVar148._0_4_ =
                 (uint)(bVar80 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 1 & 1);
            auVar148._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 2 & 1);
            auVar148._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 3 & 1);
            auVar148._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 4 & 1);
            auVar148._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar80 >> 5 & 1);
            auVar148._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
            auVar148._24_4_ =
                 (uint)(bVar80 >> 6) * auVar98._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar98 = vshufps_avx(auVar148,auVar148,0xb1);
            auVar98 = vminps_avx(auVar148,auVar98);
            auVar99 = vshufpd_avx(auVar98,auVar98,5);
            auVar98 = vminps_avx(auVar98,auVar99);
            auVar99 = vpermpd_avx2(auVar98,0x4e);
            auVar98 = vminps_avx(auVar98,auVar99);
            uVar16 = vcmpps_avx512vl(auVar148,auVar98,0);
            bVar75 = (byte)uVar16 & bVar80;
            bVar73 = bVar80;
            if (bVar75 != 0) {
              bVar73 = bVar75;
            }
            iVar19 = 0;
            for (uVar84 = (uint)bVar73; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar84 = *(uint *)(local_340 + (uint)(iVar19 << 2));
            fVar157 = auVar12._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
            if ((float)local_7e0._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar264 = ZEXT1664(auVar264._0_16_);
              auVar266 = ZEXT1664(auVar266._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar157 = sqrtf((float)local_7e0._0_4_);
              auVar87 = local_860._0_16_;
            }
            auVar253 = ZEXT464(uVar84);
            auVar85 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar92 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar97 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar93 = vminps_avx(auVar85,auVar97);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar97 = vmaxps_avx(auVar92,auVar85);
            auVar225._8_4_ = 0x7fffffff;
            auVar225._0_8_ = 0x7fffffff7fffffff;
            auVar225._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx(auVar93,auVar225);
            auVar85 = vandps_avx(auVar97,auVar225);
            auVar92 = vmaxps_avx(auVar92,auVar85);
            auVar85 = vmovshdup_avx(auVar92);
            auVar85 = vmaxss_avx(auVar85,auVar92);
            auVar92 = vshufpd_avx(auVar92,auVar92,1);
            auVar92 = vmaxss_avx(auVar92,auVar85);
            local_830._0_4_ = auVar92._0_4_ * 1.9073486e-06;
            local_6f0 = vshufps_avx(auVar97,auVar97,0xff);
            auVar87 = vinsertps_avx(ZEXT416(uVar84),auVar87,0x10);
            auVar262 = ZEXT1664(auVar87);
            lVar81 = 5;
            do {
              do {
                bVar82 = lVar81 == 0;
                lVar81 = lVar81 + -1;
                if (bVar82) goto LAB_019db3ba;
                uVar182 = auVar262._0_4_;
                auVar162._4_4_ = uVar182;
                auVar162._0_4_ = uVar182;
                auVar162._8_4_ = uVar182;
                auVar162._12_4_ = uVar182;
                auVar87 = vfmadd132ps_fma(auVar162,ZEXT816(0) << 0x40,local_7d0);
                local_740 = auVar262._0_32_;
                auVar92 = vmovshdup_avx(auVar262._0_16_);
                fVar235 = auVar92._0_4_;
                fVar272 = 1.0 - fVar235;
                fVar260 = fVar272 * fVar272 * fVar272;
                fVar258 = fVar235 * fVar235;
                fVar236 = fVar235 * fVar258;
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar260),
                                          ZEXT416((uint)fVar236));
                fVar259 = fVar235 * fVar272;
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar259 * 6.0)),
                                          ZEXT416((uint)(fVar272 * fVar259)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                          ZEXT416((uint)fVar260));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar272 * fVar259 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar235 * fVar259)));
                fVar260 = fVar260 * 0.16666667;
                fVar235 = (auVar85._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar217 = (auVar97._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar236 = fVar236 * 0.16666667;
                auVar206._0_4_ = fVar236 * (float)local_7c0._0_4_;
                auVar206._4_4_ = fVar236 * (float)local_7c0._4_4_;
                auVar206._8_4_ = fVar236 * fStack_7b8;
                auVar206._12_4_ = fVar236 * fStack_7b4;
                auVar238._4_4_ = fVar217;
                auVar238._0_4_ = fVar217;
                auVar238._8_4_ = fVar217;
                auVar238._12_4_ = fVar217;
                auVar85 = vfmadd132ps_fma(auVar238,auVar206,local_780._0_16_);
                auVar207._4_4_ = fVar235;
                auVar207._0_4_ = fVar235;
                auVar207._8_4_ = fVar235;
                auVar207._12_4_ = fVar235;
                auVar85 = vfmadd132ps_fma(auVar207,auVar85,local_7a0._0_16_);
                auVar188._4_4_ = fVar260;
                auVar188._0_4_ = fVar260;
                auVar188._8_4_ = fVar260;
                auVar188._12_4_ = fVar260;
                auVar85 = vfmadd132ps_fma(auVar188,auVar85,local_760._0_16_);
                local_620._0_16_ = auVar85;
                auVar85 = vsubps_avx(auVar87,auVar85);
                auVar87 = vdpps_avx(auVar85,auVar85,0x7f);
                local_800._0_16_ = auVar87;
                local_860._0_16_ = ZEXT416((uint)fVar272);
                if (auVar87._0_4_ < 0.0) {
                  local_880._0_4_ = fVar258;
                  local_8a0._0_4_ = fVar259;
                  auVar257._0_4_ = sqrtf(auVar87._0_4_);
                  auVar257._4_60_ = extraout_var_00;
                  auVar87 = auVar257._0_16_;
                  fVar259 = (float)local_8a0._0_4_;
                  auVar97 = local_860._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  local_880._0_4_ = fVar258;
                  auVar97 = ZEXT416((uint)fVar272);
                }
                local_640._4_4_ = auVar97._0_4_;
                local_640._0_4_ = local_640._4_4_;
                fStack_638 = (float)local_640._4_4_;
                fStack_634 = (float)local_640._4_4_;
                auVar93 = vfnmsub213ss_fma(auVar92,auVar92,ZEXT416((uint)(fVar259 * 4.0)));
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * 4.0)),auVar97,auVar97);
                fVar258 = (float)local_640._4_4_ * -(float)local_640._4_4_ * 0.5;
                fVar259 = auVar93._0_4_ * 0.5;
                fVar260 = auVar97._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar226._0_4_ = (float)local_880._0_4_ * (float)local_7c0._0_4_;
                auVar226._4_4_ = (float)local_880._0_4_ * (float)local_7c0._4_4_;
                auVar226._8_4_ = (float)local_880._0_4_ * fStack_7b8;
                auVar226._12_4_ = (float)local_880._0_4_ * fStack_7b4;
                auVar189._4_4_ = fVar260;
                auVar189._0_4_ = fVar260;
                auVar189._8_4_ = fVar260;
                auVar189._12_4_ = fVar260;
                auVar97 = vfmadd132ps_fma(auVar189,auVar226,local_780._0_16_);
                auVar208._4_4_ = fVar259;
                auVar208._0_4_ = fVar259;
                auVar208._8_4_ = fVar259;
                auVar208._12_4_ = fVar259;
                auVar97 = vfmadd132ps_fma(auVar208,auVar97,local_7a0._0_16_);
                auVar268._4_4_ = fVar258;
                auVar268._0_4_ = fVar258;
                auVar268._8_4_ = fVar258;
                auVar268._12_4_ = fVar258;
                _local_880 = vfmadd132ps_fma(auVar268,auVar97,local_760._0_16_);
                local_660._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar54._12_4_ = 0;
                auVar54._0_12_ = ZEXT812(0);
                fVar258 = local_660._0_4_;
                auVar93 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar258));
                local_680._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar258));
                auVar97 = vfnmadd213ss_fma(local_680._0_16_,local_660._0_16_,ZEXT416(0x40000000));
                local_6a0._0_4_ = auVar97._0_4_;
                local_8a0._0_4_ = auVar87._0_4_;
                if (fVar258 < -fVar258) {
                  local_840 = auVar93;
                  fVar259 = sqrtf(fVar258);
                  auVar87 = ZEXT416((uint)local_8a0._0_4_);
                  auVar97 = local_840;
                  auVar86 = _local_880;
                }
                else {
                  auVar97 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                  fVar259 = auVar97._0_4_;
                  auVar97 = auVar93;
                  auVar86 = _local_880;
                }
                fVar260 = auVar97._0_4_;
                auVar90 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar93._0_4_ * 1.5 +
                                                   fVar258 * -0.5 * fVar260 * fVar260 * fVar260)));
                auVar89 = vmulps_avx512vl(auVar86,auVar90);
                auVar97 = vdpps_avx(auVar85,auVar89,0x7f);
                fVar258 = auVar87._0_4_ + 1.0;
                fVar260 = auVar97._0_4_;
                auVar163._0_4_ = fVar260 * fVar260;
                auVar163._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                auVar163._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                auVar163._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                auVar93 = vsubps_avx(local_800._0_16_,auVar163);
                fVar235 = auVar93._0_4_;
                auVar190._4_12_ = ZEXT812(0) << 0x20;
                auVar190._0_4_ = fVar235;
                auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
                auVar94 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
                auVar95 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
                if (fVar235 < 0.0) {
                  local_840._0_4_ = fVar258;
                  local_6c0._0_4_ = auVar94._0_4_;
                  _local_6e0 = auVar90;
                  local_6d0 = auVar89;
                  local_6b0 = auVar88;
                  fVar235 = sqrtf(fVar235);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar94 = ZEXT416((uint)local_6c0._0_4_);
                  auVar87 = ZEXT416((uint)local_8a0._0_4_);
                  auVar88 = local_6b0;
                  auVar86 = _local_880;
                  fVar258 = (float)local_840._0_4_;
                  auVar89 = local_6d0;
                  auVar90 = _local_6e0;
                }
                else {
                  auVar93 = vsqrtss_avx(auVar93,auVar93);
                  fVar235 = auVar93._0_4_;
                }
                auVar271 = ZEXT1664(auVar86);
                auVar266 = ZEXT1664(local_800._0_16_);
                auVar264 = ZEXT1664(auVar85);
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar92);
                auVar91 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar261 = local_740._0_16_;
                auVar92 = vshufps_avx(auVar261,auVar261,0x55);
                auVar209._0_4_ = auVar92._0_4_ * (float)local_7c0._0_4_;
                auVar209._4_4_ = auVar92._4_4_ * (float)local_7c0._4_4_;
                auVar209._8_4_ = auVar92._8_4_ * fStack_7b8;
                auVar209._12_4_ = auVar92._12_4_ * fStack_7b4;
                auVar227._0_4_ = auVar91._0_4_;
                auVar227._4_4_ = auVar227._0_4_;
                auVar227._8_4_ = auVar227._0_4_;
                auVar227._12_4_ = auVar227._0_4_;
                auVar92 = vfmadd132ps_fma(auVar227,auVar209,local_780._0_16_);
                auVar191._0_4_ = auVar93._0_4_;
                auVar191._4_4_ = auVar191._0_4_;
                auVar191._8_4_ = auVar191._0_4_;
                auVar191._12_4_ = auVar191._0_4_;
                auVar92 = vfmadd132ps_fma(auVar191,auVar92,local_7a0._0_16_);
                auVar92 = vfmadd132ps_fma(_local_640,auVar92,local_760._0_16_);
                auVar192._0_4_ = auVar92._0_4_ * (float)local_660._0_4_;
                auVar192._4_4_ = auVar92._4_4_ * (float)local_660._0_4_;
                auVar192._8_4_ = auVar92._8_4_ * (float)local_660._0_4_;
                auVar192._12_4_ = auVar92._12_4_ * (float)local_660._0_4_;
                auVar92 = vdpps_avx(auVar86,auVar92,0x7f);
                fVar217 = auVar92._0_4_;
                auVar210._0_4_ = auVar86._0_4_ * fVar217;
                auVar210._4_4_ = auVar86._4_4_ * fVar217;
                auVar210._8_4_ = auVar86._8_4_ * fVar217;
                auVar210._12_4_ = auVar86._12_4_ * fVar217;
                auVar92 = vsubps_avx(auVar192,auVar210);
                fVar217 = (float)local_6a0._0_4_ * (float)local_680._0_4_;
                auVar91 = vmaxss_avx(ZEXT416((uint)local_830._0_4_),
                                     ZEXT416((uint)(local_740._0_4_ * fVar157 * 1.9073486e-06)));
                auVar211._0_4_ = auVar92._0_4_ * fVar217;
                auVar211._4_4_ = auVar92._4_4_ * fVar217;
                auVar211._8_4_ = auVar92._8_4_ * fVar217;
                auVar211._12_4_ = auVar92._12_4_ * fVar217;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar96 = vxorps_avx512vl(auVar86,auVar24);
                auVar90 = vmulps_avx512vl(auVar90,auVar211);
                auVar92 = vdpps_avx(auVar96,auVar89,0x7f);
                auVar93 = vfmadd213ss_fma(auVar87,ZEXT416((uint)local_830._0_4_),auVar91);
                auVar87 = vdpps_avx(auVar85,auVar90,0x7f);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)fVar258),
                                          ZEXT416((uint)((float)local_830._0_4_ / fVar259)),auVar93)
                ;
                fVar258 = auVar92._0_4_ + auVar87._0_4_;
                auVar87 = vdpps_avx(local_7d0,auVar89,0x7f);
                auVar92 = vdpps_avx(auVar85,auVar96,0x7f);
                auVar93 = vmulss_avx512f(auVar95,auVar88);
                auVar94 = vaddss_avx512f(auVar94,ZEXT416((uint)(auVar93._0_4_ *
                                                               auVar88._0_4_ * auVar88._0_4_)));
                auVar93 = vdpps_avx(auVar85,local_7d0,0x7f);
                auVar89 = vfnmadd231ss_fma(auVar92,auVar97,ZEXT416((uint)fVar258));
                auVar93 = vfnmadd231ss_fma(auVar93,auVar97,auVar87);
                auVar92 = vpermilps_avx(local_620._0_16_,0xff);
                fVar235 = fVar235 - auVar92._0_4_;
                auVar88 = vshufps_avx(auVar86,auVar86,0xff);
                auVar92 = vfmsub213ss_fma(auVar89,auVar94,auVar88);
                auVar255._8_4_ = 0x80000000;
                auVar255._0_8_ = 0x8000000080000000;
                auVar255._12_4_ = 0x80000000;
                auVar257 = ZEXT1664(auVar255);
                auVar250._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
                auVar250._8_4_ = auVar92._8_4_ ^ 0x80000000;
                auVar250._12_4_ = auVar92._12_4_ ^ 0x80000000;
                auVar253 = ZEXT1664(auVar250);
                auVar93 = ZEXT416((uint)(auVar93._0_4_ * auVar94._0_4_));
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar258),auVar93);
                auVar92 = vinsertps_avx(auVar250,auVar93,0x1c);
                auVar244._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                auVar244._8_4_ = auVar87._8_4_ ^ 0x80000000;
                auVar244._12_4_ = auVar87._12_4_ ^ 0x80000000;
                auVar93 = vinsertps_avx(ZEXT416((uint)fVar258),auVar244,0x10);
                auVar228._0_4_ = auVar89._0_4_;
                auVar228._4_4_ = auVar228._0_4_;
                auVar228._8_4_ = auVar228._0_4_;
                auVar228._12_4_ = auVar228._0_4_;
                auVar87 = vdivps_avx(auVar92,auVar228);
                auVar92 = vdivps_avx(auVar93,auVar228);
                auVar229._0_4_ = fVar260 * auVar87._0_4_ + fVar235 * auVar92._0_4_;
                auVar229._4_4_ = fVar260 * auVar87._4_4_ + fVar235 * auVar92._4_4_;
                auVar229._8_4_ = fVar260 * auVar87._8_4_ + fVar235 * auVar92._8_4_;
                auVar229._12_4_ = fVar260 * auVar87._12_4_ + fVar235 * auVar92._12_4_;
                auVar87 = vsubps_avx(auVar261,auVar229);
                auVar262 = ZEXT1664(auVar87);
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx512vl(auVar97,auVar25);
              } while (auVar90._0_4_ <= auVar92._0_4_);
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar91._0_4_)),local_6f0,
                                        ZEXT416(0x36000000));
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar97 = vandps_avx512vl(ZEXT416((uint)fVar235),auVar26);
            } while (auVar92._0_4_ <= auVar97._0_4_);
            fVar157 = auVar87._0_4_ + (float)local_700._0_4_;
            if ((fVar174 <= fVar157) &&
               (fVar258 = pre->ray_space[4].vz.field_0.m128[(long)ray], fVar157 <= fVar258)) {
              auVar92 = vmovshdup_avx(auVar87);
              fVar259 = auVar92._0_4_;
              if ((0.0 <= fVar259) && (fVar259 <= 1.0)) {
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_800._0_4_));
                fVar260 = auVar92._0_4_;
                lVar81 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar176 * 8);
                if ((*(uint *)(lVar81 + 0x34) & (uint)pre->ray_space[5].vy.field_0.m128[(long)ray])
                    != 0) {
                  fVar260 = fVar260 * 1.5 + local_800._0_4_ * -0.5 * fVar260 * fVar260 * fVar260;
                  auVar230._0_4_ = auVar85._0_4_ * fVar260;
                  auVar230._4_4_ = auVar85._4_4_ * fVar260;
                  auVar230._8_4_ = auVar85._8_4_ * fVar260;
                  auVar230._12_4_ = auVar85._12_4_ * fVar260;
                  auVar88 = vfmadd213ps_fma(auVar88,auVar230,auVar86);
                  auVar92 = vshufps_avx(auVar230,auVar230,0xc9);
                  auVar97 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar231._0_4_ = auVar230._0_4_ * auVar97._0_4_;
                  auVar231._4_4_ = auVar230._4_4_ * auVar97._4_4_;
                  auVar231._8_4_ = auVar230._8_4_ * auVar97._8_4_;
                  auVar231._12_4_ = auVar230._12_4_ * auVar97._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar231,auVar86,auVar92);
                  auVar92 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar97 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                  auVar164._0_4_ = auVar88._0_4_ * auVar93._0_4_;
                  auVar164._4_4_ = auVar88._4_4_ * auVar93._4_4_;
                  auVar164._8_4_ = auVar88._8_4_ * auVar93._8_4_;
                  auVar164._12_4_ = auVar88._12_4_ * auVar93._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar164,auVar92,auVar97);
                  fVar260 = auVar92._0_4_;
                  if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) &&
                     (*(long *)(lVar81 + 0x40) == 0)) {
                    pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar157;
                    fVar157 = (float)vextractps_avx(auVar92,1);
                    pre->ray_space[7].vy.field_0.m128[(long)ray] = fVar157;
                    uVar182 = vextractps_avx(auVar92,2);
                    *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x20) = uVar182;
                    pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar260;
                    pre[1].ray_space[0].vz.field_0.m128[(long)ray] = fVar259;
                    pre[1].ray_space[1].vy.field_0.m128[(long)ray] = 0.0;
                    pre[1].ray_space[2].vx.field_0.m128[(long)ray] = fVar2;
                    pre[1].ray_space[2].vz.field_0.m128[(long)ray] = fVar176;
                    pre[1].ray_space[3].vy.field_0.m128[(long)ray] = **(float **)(k + 8);
                    pre[1].ray_space[4].vx.field_0.m128[(long)ray] =
                         *(float *)(*(long *)(k + 8) + 4);
                  }
                  else {
                    puVar3 = *(undefined4 **)(k + 8);
                    auVar233._8_4_ = 1;
                    auVar233._0_8_ = 0x100000001;
                    auVar233._12_4_ = 1;
                    auVar233._16_4_ = 1;
                    auVar233._20_4_ = 1;
                    auVar233._24_4_ = 1;
                    auVar233._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar233,ZEXT1632(auVar87));
                    local_480 = vpermps_avx2(auVar233,ZEXT1632(auVar92));
                    auVar242._8_4_ = 2;
                    auVar242._0_8_ = 0x200000002;
                    auVar242._12_4_ = 2;
                    auVar242._16_4_ = 2;
                    auVar242._20_4_ = 2;
                    auVar242._24_4_ = 2;
                    auVar242._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar242,ZEXT1632(auVar92));
                    local_440 = fVar260;
                    fStack_43c = fVar260;
                    fStack_438 = fVar260;
                    fStack_434 = fVar260;
                    fStack_430 = fVar260;
                    fStack_42c = fVar260;
                    fStack_428 = fVar260;
                    fStack_424 = fVar260;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4e0._0_8_;
                    uStack_3d8 = local_4e0._8_8_;
                    uStack_3d0 = local_4e0._16_8_;
                    uStack_3c8 = local_4e0._24_8_;
                    local_3c0 = local_4c0;
                    auVar98 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_820[1] = auVar98;
                    *local_820 = auVar98;
                    local_3a0._0_4_ = *puVar3;
                    local_3a0._4_4_ = local_3a0._0_4_;
                    local_3a0._8_4_ = local_3a0._0_4_;
                    local_3a0._12_4_ = local_3a0._0_4_;
                    local_3a0._16_4_ = local_3a0._0_4_;
                    local_3a0._20_4_ = local_3a0._0_4_;
                    local_3a0._24_4_ = local_3a0._0_4_;
                    local_3a0._28_4_ = local_3a0._0_4_;
                    local_380 = puVar3[1];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar157;
                    local_720 = local_520;
                    local_8d0 = local_720;
                    local_8c8 = *(undefined8 *)(lVar81 + 0x18);
                    local_8c0 = *(undefined8 *)(k + 8);
                    local_8b0 = (int *)local_480;
                    local_8a8 = 8;
                    local_8b8 = pre;
                    if (*(code **)(lVar81 + 0x40) != (code *)0x0) {
                      auVar253 = ZEXT1664(auVar250);
                      auVar257 = ZEXT1664(auVar255);
                      auVar262 = ZEXT1664(auVar87);
                      auVar264 = ZEXT1664(auVar85);
                      auVar266 = ZEXT1664(local_800._0_16_);
                      auVar271 = ZEXT1664(auVar86);
                      (**(code **)(lVar81 + 0x40))(&local_8d0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      pcVar4 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                      if ((pcVar4 != (code *)0x0) &&
                         (((**(byte **)(k + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar81 + 0x3e) & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        (*pcVar4)(&local_8d0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar83 = vptestmd_avx512vl(local_720,local_720);
                        iVar55 = local_8b0[1];
                        iVar56 = local_8b0[2];
                        iVar57 = local_8b0[3];
                        iVar58 = local_8b0[4];
                        iVar59 = local_8b0[5];
                        iVar60 = local_8b0[6];
                        iVar61 = local_8b0[7];
                        pVVar1 = &local_8b8->ray_space[7].vy;
                        iVar62 = *(int *)((long)&local_8b8->ray_space[7].vy.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8->ray_space[7].vy.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8->ray_space[7].vy.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8->ray_space[7].vz.field_0;
                        iVar66 = *(int *)((long)&local_8b8->ray_space[7].vz.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8->ray_space[7].vz.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8->ray_space[7].vz.field_0 + 0xc);
                        bVar73 = (byte)uVar83;
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar73 & 1) * *local_8b0 |
                                    (uint)!(bool)(bVar73 & 1) * *(int *)&pVVar1->field_0);
                        local_8b8->ray_space[7].vy.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8->ray_space[7].vy.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8->ray_space[7].vy.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8->ray_space[7].vz.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8->ray_space[7].vz.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8->ray_space[7].vz.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8->ray_space[7].vz.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        iVar55 = local_8b0[9];
                        iVar56 = local_8b0[10];
                        iVar57 = local_8b0[0xb];
                        iVar58 = local_8b0[0xc];
                        iVar59 = local_8b0[0xd];
                        iVar60 = local_8b0[0xe];
                        iVar61 = local_8b0[0xf];
                        iVar62 = local_8b8[1].depth_scale.field_0.i[1];
                        iVar63 = local_8b8[1].depth_scale.field_0.i[2];
                        iVar64 = local_8b8[1].depth_scale.field_0.i[3];
                        iVar65 = local_8b8[1].depth_scale.field_0.i[4];
                        iVar66 = local_8b8[1].depth_scale.field_0.i[5];
                        iVar67 = local_8b8[1].depth_scale.field_0.i[6];
                        iVar68 = local_8b8[1].depth_scale.field_0.i[7];
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        local_8b8[1].depth_scale.field_0.i[0] =
                             (uint)(bVar73 & 1) * local_8b0[8] |
                             (uint)!(bool)(bVar73 & 1) * local_8b8[1].depth_scale.field_0.i[0];
                        local_8b8[1].depth_scale.field_0.i[1] =
                             (uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62;
                        local_8b8[1].depth_scale.field_0.i[2] =
                             (uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63;
                        local_8b8[1].depth_scale.field_0.i[3] =
                             (uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64;
                        local_8b8[1].depth_scale.field_0.i[4] =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65;
                        local_8b8[1].depth_scale.field_0.i[5] =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66;
                        local_8b8[1].depth_scale.field_0.i[6] =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67;
                        local_8b8[1].depth_scale.field_0.i[7] =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68;
                        iVar55 = local_8b0[0x11];
                        iVar56 = local_8b0[0x12];
                        iVar57 = local_8b0[0x13];
                        iVar58 = local_8b0[0x14];
                        iVar59 = local_8b0[0x15];
                        iVar60 = local_8b0[0x16];
                        iVar61 = local_8b0[0x17];
                        iVar62 = *(int *)((long)&local_8b8[1].ray_space[0].vx.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8[1].ray_space[0].vx.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8[1].ray_space[0].vx.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8[1].ray_space[0].vy.field_0;
                        iVar66 = *(int *)((long)&local_8b8[1].ray_space[0].vy.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8[1].ray_space[0].vy.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8[1].ray_space[0].vy.field_0 + 0xc);
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        local_8b8[1].ray_space[0].vx.field_0.m128[0] =
                             (float)((uint)(bVar73 & 1) * local_8b0[0x10] |
                                    (uint)!(bool)(bVar73 & 1) *
                                    *(int *)&local_8b8[1].ray_space[0].vx.field_0);
                        local_8b8[1].ray_space[0].vx.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8[1].ray_space[0].vx.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8[1].ray_space[0].vx.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8[1].ray_space[0].vy.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8[1].ray_space[0].vy.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8[1].ray_space[0].vy.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8[1].ray_space[0].vy.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        iVar55 = local_8b0[0x19];
                        iVar56 = local_8b0[0x1a];
                        iVar57 = local_8b0[0x1b];
                        iVar58 = local_8b0[0x1c];
                        iVar59 = local_8b0[0x1d];
                        iVar60 = local_8b0[0x1e];
                        iVar61 = local_8b0[0x1f];
                        pVVar1 = &local_8b8[1].ray_space[0].vz;
                        iVar62 = *(int *)((long)&local_8b8[1].ray_space[0].vz.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8[1].ray_space[0].vz.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8[1].ray_space[0].vz.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8[1].ray_space[1].vx.field_0;
                        iVar66 = *(int *)((long)&local_8b8[1].ray_space[1].vx.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8[1].ray_space[1].vx.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8[1].ray_space[1].vx.field_0 + 0xc);
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar73 & 1) * local_8b0[0x18] |
                                    (uint)!(bool)(bVar73 & 1) * *(int *)&pVVar1->field_0);
                        local_8b8[1].ray_space[0].vz.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8[1].ray_space[0].vz.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8[1].ray_space[0].vz.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8[1].ray_space[1].vx.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8[1].ray_space[1].vx.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8[1].ray_space[1].vx.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8[1].ray_space[1].vx.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        iVar55 = local_8b0[0x21];
                        iVar56 = local_8b0[0x22];
                        iVar57 = local_8b0[0x23];
                        iVar58 = local_8b0[0x24];
                        iVar59 = local_8b0[0x25];
                        iVar60 = local_8b0[0x26];
                        iVar61 = local_8b0[0x27];
                        pVVar1 = &local_8b8[1].ray_space[1].vy;
                        iVar62 = *(int *)((long)&local_8b8[1].ray_space[1].vy.field_0 + 4);
                        iVar63 = *(int *)((long)&local_8b8[1].ray_space[1].vy.field_0 + 8);
                        iVar64 = *(int *)((long)&local_8b8[1].ray_space[1].vy.field_0 + 0xc);
                        iVar65 = *(int *)&local_8b8[1].ray_space[1].vz.field_0;
                        iVar66 = *(int *)((long)&local_8b8[1].ray_space[1].vz.field_0 + 4);
                        iVar67 = *(int *)((long)&local_8b8[1].ray_space[1].vz.field_0 + 8);
                        iVar68 = *(int *)((long)&local_8b8[1].ray_space[1].vz.field_0 + 0xc);
                        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar10 = SUB81(uVar83 >> 7,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar73 & 1) * local_8b0[0x20] |
                                    (uint)!(bool)(bVar73 & 1) * *(int *)&pVVar1->field_0);
                        local_8b8[1].ray_space[1].vy.field_0.m128[1] =
                             (float)((uint)bVar82 * iVar55 | (uint)!bVar82 * iVar62);
                        local_8b8[1].ray_space[1].vy.field_0.m128[2] =
                             (float)((uint)bVar5 * iVar56 | (uint)!bVar5 * iVar63);
                        local_8b8[1].ray_space[1].vy.field_0.m128[3] =
                             (float)((uint)bVar6 * iVar57 | (uint)!bVar6 * iVar64);
                        local_8b8[1].ray_space[1].vz.field_0.m128[0] =
                             (float)((uint)bVar7 * iVar58 | (uint)!bVar7 * iVar65);
                        local_8b8[1].ray_space[1].vz.field_0.m128[1] =
                             (float)((uint)bVar8 * iVar59 | (uint)!bVar8 * iVar66);
                        local_8b8[1].ray_space[1].vz.field_0.m128[2] =
                             (float)((uint)bVar9 * iVar60 | (uint)!bVar9 * iVar67);
                        local_8b8[1].ray_space[1].vz.field_0.m128[3] =
                             (float)((uint)bVar10 * iVar61 | (uint)!bVar10 * iVar68);
                        auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x28));
                        local_8b8[1].ray_space[2].vx = (Vector)auVar98._0_16_;
                        local_8b8[1].ray_space[2].vy = (Vector)auVar98._16_16_;
                        auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x30));
                        *(undefined1 (*) [32])&local_8b8[1].ray_space[2].vz = auVar98;
                        auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x38));
                        local_8b8[1].ray_space[3].vy = (Vector)auVar98._0_16_;
                        local_8b8[1].ray_space[3].vz = (Vector)auVar98._16_16_;
                        auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8b0 + 0x40));
                        local_8b8[1].ray_space[4].vx = (Vector)auVar98._0_16_;
                        local_8b8[1].ray_space[4].vy = (Vector)auVar98._16_16_;
                        goto LAB_019db3ba;
                      }
                    }
                    pre->ray_space[4].vz.field_0.m128[(long)ray] = fVar258;
                  }
                }
              }
            }
LAB_019db3ba:
            uVar182 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
            auVar246._4_4_ = uVar182;
            auVar246._0_4_ = uVar182;
            auVar246._8_4_ = uVar182;
            auVar246._12_4_ = uVar182;
            auVar246._16_4_ = uVar182;
            auVar246._20_4_ = uVar182;
            auVar246._24_4_ = uVar182;
            auVar246._28_4_ = uVar182;
            auVar247 = ZEXT3264(auVar246);
            auVar70._4_4_ = fStack_55c;
            auVar70._0_4_ = local_560;
            auVar70._8_4_ = fStack_558;
            auVar70._12_4_ = fStack_554;
            auVar70._16_4_ = fStack_550;
            auVar70._20_4_ = fStack_54c;
            auVar70._24_4_ = fStack_548;
            auVar70._28_4_ = fStack_544;
            uVar16 = vcmpps_avx512vl(auVar246,auVar70,0xd);
          }
          uVar18 = vpcmpd_avx512vl(local_500,local_320,1);
          uVar17 = vpcmpd_avx512vl(local_500,_local_580,1);
          auVar195._0_4_ = (float)local_5a0._0_4_ + (float)local_200._0_4_;
          auVar195._4_4_ = (float)local_5a0._4_4_ + (float)local_200._4_4_;
          auVar195._8_4_ = fStack_598 + fStack_1f8;
          auVar195._12_4_ = fStack_594 + fStack_1f4;
          auVar195._16_4_ = fStack_590 + fStack_1f0;
          auVar195._20_4_ = fStack_58c + fStack_1ec;
          auVar195._24_4_ = fStack_588 + fStack_1e8;
          auVar195._28_4_ = fStack_584 + fStack_1e4;
          uVar182 = auVar247._0_4_;
          auVar212._4_4_ = uVar182;
          auVar212._0_4_ = uVar182;
          auVar212._8_4_ = uVar182;
          auVar212._12_4_ = uVar182;
          auVar212._16_4_ = uVar182;
          auVar212._20_4_ = uVar182;
          auVar212._24_4_ = uVar182;
          auVar212._28_4_ = uVar182;
          uVar16 = vcmpps_avx512vl(auVar195,auVar212,2);
          bVar78 = bVar78 & (byte)uVar18 & (byte)uVar16;
          auVar234._0_4_ = (float)local_5a0._0_4_ + (float)local_360._0_4_;
          auVar234._4_4_ = (float)local_5a0._4_4_ + (float)local_360._4_4_;
          auVar234._8_4_ = fStack_598 + fStack_358;
          auVar234._12_4_ = fStack_594 + fStack_354;
          auVar234._16_4_ = fStack_590 + fStack_350;
          auVar234._20_4_ = fStack_58c + fStack_34c;
          auVar234._24_4_ = fStack_588 + fStack_348;
          auVar234._28_4_ = fStack_584 + fStack_344;
          uVar16 = vcmpps_avx512vl(auVar234,auVar212,2);
          bVar72 = bVar72 & (byte)uVar17 & (byte)uVar16 | bVar78;
          if (bVar72 != 0) {
            abStack_180[uVar76 * 0x60] = bVar72;
            bVar82 = (bool)(bVar78 >> 1 & 1);
            bVar5 = (bool)(bVar78 >> 2 & 1);
            bVar6 = (bool)(bVar78 >> 3 & 1);
            bVar7 = (bool)(bVar78 >> 4 & 1);
            bVar8 = (bool)(bVar78 >> 5 & 1);
            auStack_160[uVar76 * 0x18] =
                 (uint)(bVar78 & 1) * local_200._0_4_ | (uint)!(bool)(bVar78 & 1) * local_360._0_4_;
            auStack_160[uVar76 * 0x18 + 1] =
                 (uint)bVar82 * local_200._4_4_ | (uint)!bVar82 * local_360._4_4_;
            auStack_160[uVar76 * 0x18 + 2] =
                 (uint)bVar5 * (int)fStack_1f8 | (uint)!bVar5 * (int)fStack_358;
            auStack_160[uVar76 * 0x18 + 3] =
                 (uint)bVar6 * (int)fStack_1f4 | (uint)!bVar6 * (int)fStack_354;
            auStack_160[uVar76 * 0x18 + 4] =
                 (uint)bVar7 * (int)fStack_1f0 | (uint)!bVar7 * (int)fStack_350;
            auStack_160[uVar76 * 0x18 + 5] =
                 (uint)bVar8 * (int)fStack_1ec | (uint)!bVar8 * (int)fStack_34c;
            auStack_160[uVar76 * 0x18 + 6] =
                 (uint)(bVar78 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar78 >> 6) * (int)fStack_348;
            (&fStack_144)[uVar76 * 0x18] = fStack_344;
            uVar83 = vmovlps_avx(local_530);
            (&uStack_140)[uVar76 * 0xc] = uVar83;
            aiStack_138[uVar76 * 0x18] = iVar79 + 1;
            uVar76 = (ulong)((int)uVar76 + 1);
          }
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar274 = ZEXT3264(auVar98);
          auVar247 = ZEXT3264(_DAT_01f7b040);
          lVar81 = local_818;
          context = local_810;
        }
      }
    }
    do {
      uVar84 = (uint)uVar76;
      uVar76 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        uVar182 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
        auVar33._4_4_ = uVar182;
        auVar33._0_4_ = uVar182;
        auVar33._8_4_ = uVar182;
        auVar33._12_4_ = uVar182;
        auVar33._16_4_ = uVar182;
        auVar33._20_4_ = uVar182;
        auVar33._24_4_ = uVar182;
        auVar33._28_4_ = uVar182;
        uVar16 = vcmpps_avx512vl(local_300,auVar33,2);
        local_808 = (ulong)((uint)local_808 & (uint)uVar16);
        goto LAB_019d8dcf;
      }
      auVar98 = *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x18);
      auVar196._0_4_ = auVar98._0_4_ + (float)local_5a0._0_4_;
      auVar196._4_4_ = auVar98._4_4_ + (float)local_5a0._4_4_;
      auVar196._8_4_ = auVar98._8_4_ + fStack_598;
      auVar196._12_4_ = auVar98._12_4_ + fStack_594;
      auVar196._16_4_ = auVar98._16_4_ + fStack_590;
      auVar196._20_4_ = auVar98._20_4_ + fStack_58c;
      auVar196._24_4_ = auVar98._24_4_ + fStack_588;
      auVar196._28_4_ = auVar98._28_4_ + fStack_584;
      uVar182 = *(undefined4 *)((long)&pre->ray_space[4].vz.field_0 + (long)ray * 4);
      auVar32._4_4_ = uVar182;
      auVar32._0_4_ = uVar182;
      auVar32._8_4_ = uVar182;
      auVar32._12_4_ = uVar182;
      auVar32._16_4_ = uVar182;
      auVar32._20_4_ = uVar182;
      auVar32._24_4_ = uVar182;
      auVar32._28_4_ = uVar182;
      uVar16 = vcmpps_avx512vl(auVar196,auVar32,2);
      uVar150 = (uint)uVar16 & (uint)abStack_180[uVar76 * 0x60];
    } while (uVar150 == 0);
    uVar83 = (&uStack_140)[uVar76 * 0xc];
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar83;
    auVar213._8_4_ = 0x7f800000;
    auVar213._0_8_ = 0x7f8000007f800000;
    auVar213._12_4_ = 0x7f800000;
    auVar213._16_4_ = 0x7f800000;
    auVar213._20_4_ = 0x7f800000;
    auVar213._24_4_ = 0x7f800000;
    auVar213._28_4_ = 0x7f800000;
    auVar99 = vblendmps_avx512vl(auVar213,auVar98);
    bVar72 = (byte)uVar150;
    auVar149._0_4_ =
         (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar98._0_4_;
    bVar82 = (bool)((byte)(uVar150 >> 1) & 1);
    auVar149._4_4_ = (uint)bVar82 * auVar99._4_4_ | (uint)!bVar82 * (int)auVar98._4_4_;
    bVar82 = (bool)((byte)(uVar150 >> 2) & 1);
    auVar149._8_4_ = (uint)bVar82 * auVar99._8_4_ | (uint)!bVar82 * (int)auVar98._8_4_;
    bVar82 = (bool)((byte)(uVar150 >> 3) & 1);
    auVar149._12_4_ = (uint)bVar82 * auVar99._12_4_ | (uint)!bVar82 * (int)auVar98._12_4_;
    bVar82 = (bool)((byte)(uVar150 >> 4) & 1);
    auVar149._16_4_ = (uint)bVar82 * auVar99._16_4_ | (uint)!bVar82 * (int)auVar98._16_4_;
    bVar82 = (bool)((byte)(uVar150 >> 5) & 1);
    auVar149._20_4_ = (uint)bVar82 * auVar99._20_4_ | (uint)!bVar82 * (int)auVar98._20_4_;
    bVar82 = (bool)((byte)(uVar150 >> 6) & 1);
    auVar149._24_4_ = (uint)bVar82 * auVar99._24_4_ | (uint)!bVar82 * (int)auVar98._24_4_;
    auVar149._28_4_ =
         (uVar150 >> 7) * auVar99._28_4_ | (uint)!SUB41(uVar150 >> 7,0) * (int)auVar98._28_4_;
    auVar98 = vshufps_avx(auVar149,auVar149,0xb1);
    auVar98 = vminps_avx(auVar149,auVar98);
    auVar99 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar99);
    auVar99 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar99);
    uVar16 = vcmpps_avx512vl(auVar149,auVar98,0);
    bVar80 = (byte)uVar16 & bVar72;
    if (bVar80 != 0) {
      uVar150 = (uint)bVar80;
    }
    uVar151 = 0;
    for (; (uVar150 & 1) == 0; uVar150 = uVar150 >> 1 | 0x80000000) {
      uVar151 = uVar151 + 1;
    }
    iVar79 = aiStack_138[uVar76 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar151 & 0x1f)) & bVar72;
    abStack_180[uVar76 * 0x60] = bVar72;
    if (bVar72 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar182 = (undefined4)uVar83;
    auVar173._4_4_ = uVar182;
    auVar173._0_4_ = uVar182;
    auVar173._8_4_ = uVar182;
    auVar173._12_4_ = uVar182;
    auVar173._16_4_ = uVar182;
    auVar173._20_4_ = uVar182;
    auVar173._24_4_ = uVar182;
    auVar173._28_4_ = uVar182;
    auVar87 = vmovshdup_avx(auVar193);
    auVar87 = vsubps_avx(auVar87,auVar193);
    auVar197._0_4_ = auVar87._0_4_;
    auVar197._4_4_ = auVar197._0_4_;
    auVar197._8_4_ = auVar197._0_4_;
    auVar197._12_4_ = auVar197._0_4_;
    auVar197._16_4_ = auVar197._0_4_;
    auVar197._20_4_ = auVar197._0_4_;
    auVar197._24_4_ = auVar197._0_4_;
    auVar197._28_4_ = auVar197._0_4_;
    auVar87 = vfmadd132ps_fma(auVar197,auVar173,auVar247._0_32_);
    local_480 = ZEXT1632(auVar87);
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_480 + (ulong)uVar151 * 4);
    uVar76 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }